

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_t<embree::sse2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined6 uVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  int iVar39;
  undefined4 uVar40;
  ulong uVar41;
  long lVar42;
  undefined4 uVar46;
  RTCFilterFunctionN p_Var43;
  undefined8 uVar44;
  undefined1 (*pauVar45) [16];
  ulong uVar47;
  ulong uVar48;
  bool bVar49;
  int iVar50;
  bool bVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  short sVar56;
  float fVar57;
  uint uVar58;
  float fVar100;
  float fVar102;
  __m128 a_1;
  undefined2 uVar99;
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  uint uVar101;
  uint uVar103;
  uint uVar104;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar105;
  float fVar121;
  float fVar122;
  vfloat4 v;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar123;
  float fVar124;
  float fVar133;
  float fVar134;
  vfloat_impl<4> t;
  float fVar135;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar136;
  float fVar148;
  float fVar149;
  vfloat4 v_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar150;
  float fVar167;
  float fVar168;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar169;
  float fVar178;
  float fVar179;
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar180;
  float fVar192;
  float fVar193;
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar194;
  float fVar224;
  float fVar225;
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  float fVar237;
  float fVar238;
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar239;
  float fVar246;
  float fVar247;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar248;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar254;
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar256 [16];
  float fVar260;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar268;
  float fVar273;
  float fVar274;
  undefined1 auVar270 [16];
  undefined1 auVar272 [16];
  undefined1 auVar275 [16];
  vfloat4 a;
  undefined1 auVar276 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  int local_57c;
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined4 uStack_524;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined4 local_4fc;
  RTCFilterFunctionNArguments local_4f8;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 local_498;
  float fStack_490;
  float fStack_48c;
  undefined4 local_488;
  undefined4 local_484;
  uint local_480;
  uint local_47c;
  uint local_478;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  Primitive *local_378;
  ulong local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  float local_178;
  float fStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 uVar98;
  undefined1 auVar164 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar223 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar269 [16];
  undefined1 auVar271 [16];
  
  PVar6 = prim[1];
  uVar48 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar48 * 0x19 + 6;
  fVar122 = *(float *)(pPVar5 + 0xc);
  fVar136 = ((ray->org).field_0.m128[0] - *(float *)pPVar5) * fVar122;
  fVar148 = ((ray->org).field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar122;
  fVar149 = ((ray->org).field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar122;
  fVar105 = fVar122 * (ray->dir).field_0.m128[0];
  fVar121 = fVar122 * (ray->dir).field_0.m128[1];
  fVar122 = fVar122 * (ray->dir).field_0.m128[2];
  uVar46 = *(undefined4 *)(prim + uVar48 * 4 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar44 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar44 >> 0x20),uVar98),uVar98);
  sVar56 = CONCAT11((char)uVar46,(char)uVar46);
  uVar47 = CONCAT62(uVar23,sVar56);
  auVar233._8_4_ = 0;
  auVar233._0_8_ = uVar47;
  auVar233._12_2_ = uVar99;
  auVar233._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar44 >> 0x20);
  auVar241._12_4_ = auVar233._12_4_;
  auVar241._8_2_ = 0;
  auVar241._0_8_ = uVar47;
  auVar241._10_2_ = uVar99;
  auVar67._10_6_ = auVar241._10_6_;
  auVar67._8_2_ = uVar99;
  auVar67._0_8_ = uVar47;
  uVar99 = (undefined2)uVar23;
  auVar24._4_8_ = auVar67._8_8_;
  auVar24._2_2_ = uVar99;
  auVar24._0_2_ = uVar99;
  fVar123 = (float)((int)sVar56 >> 8);
  fVar133 = (float)(auVar24._0_4_ >> 0x18);
  fVar134 = (float)(auVar67._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar48 * 5 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar44 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar44 >> 0x20),uVar98),uVar98);
  sVar56 = CONCAT11((char)uVar46,(char)uVar46);
  uVar47 = CONCAT62(uVar23,sVar56);
  auVar60._8_4_ = 0;
  auVar60._0_8_ = uVar47;
  auVar60._12_2_ = uVar99;
  auVar60._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar44 >> 0x20);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar47;
  auVar59._10_2_ = uVar99;
  auVar187._10_6_ = auVar59._10_6_;
  auVar187._8_2_ = uVar99;
  auVar187._0_8_ = uVar47;
  uVar99 = (undefined2)uVar23;
  auVar25._4_8_ = auVar187._8_8_;
  auVar25._2_2_ = uVar99;
  auVar25._0_2_ = uVar99;
  fVar150 = (float)((int)sVar56 >> 8);
  fVar167 = (float)(auVar25._0_4_ >> 0x18);
  fVar168 = (float)(auVar187._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar48 * 6 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar44 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar44 >> 0x20),uVar98),uVar98);
  sVar56 = CONCAT11((char)uVar46,(char)uVar46);
  uVar47 = CONCAT62(uVar23,sVar56);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar47;
  auVar63._12_2_ = uVar99;
  auVar63._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar44 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar47;
  auVar62._10_2_ = uVar99;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar99;
  auVar61._0_8_ = uVar47;
  uVar99 = (undefined2)uVar23;
  auVar26._4_8_ = auVar61._8_8_;
  auVar26._2_2_ = uVar99;
  auVar26._0_2_ = uVar99;
  fVar169 = (float)((int)sVar56 >> 8);
  fVar178 = (float)(auVar26._0_4_ >> 0x18);
  fVar179 = (float)(auVar61._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar48 * 0xb + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar44 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar44 >> 0x20),uVar98),uVar98);
  sVar56 = CONCAT11((char)uVar46,(char)uVar46);
  uVar47 = CONCAT62(uVar23,sVar56);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar47;
  auVar66._12_2_ = uVar99;
  auVar66._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar44 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar47;
  auVar65._10_2_ = uVar99;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar99;
  auVar64._0_8_ = uVar47;
  uVar99 = (undefined2)uVar23;
  auVar27._4_8_ = auVar64._8_8_;
  auVar27._2_2_ = uVar99;
  auVar27._0_2_ = uVar99;
  fVar57 = (float)((int)sVar56 >> 8);
  fVar100 = (float)(auVar27._0_4_ >> 0x18);
  fVar102 = (float)(auVar64._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar44 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar44 >> 0x20),uVar98),uVar98);
  sVar56 = CONCAT11((char)uVar46,(char)uVar46);
  uVar47 = CONCAT62(uVar23,sVar56);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar47;
  auVar183._12_2_ = uVar99;
  auVar183._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar44 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar47;
  auVar182._10_2_ = uVar99;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar99;
  auVar181._0_8_ = uVar47;
  uVar99 = (undefined2)uVar23;
  auVar28._4_8_ = auVar181._8_8_;
  auVar28._2_2_ = uVar99;
  auVar28._0_2_ = uVar99;
  fVar180 = (float)((int)sVar56 >> 8);
  fVar192 = (float)(auVar28._0_4_ >> 0x18);
  fVar193 = (float)(auVar181._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar48 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar44 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar44 >> 0x20),uVar98),uVar98);
  sVar56 = CONCAT11((char)uVar46,(char)uVar46);
  uVar47 = CONCAT62(uVar23,sVar56);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar47;
  auVar197._12_2_ = uVar99;
  auVar197._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar44 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar47;
  auVar196._10_2_ = uVar99;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar99;
  auVar195._0_8_ = uVar47;
  uVar99 = (undefined2)uVar23;
  auVar29._4_8_ = auVar195._8_8_;
  auVar29._2_2_ = uVar99;
  auVar29._0_2_ = uVar99;
  fVar239 = (float)((int)sVar56 >> 8);
  fVar246 = (float)(auVar29._0_4_ >> 0x18);
  fVar247 = (float)(auVar195._8_4_ >> 0x18);
  uVar41 = (ulong)(uint)((int)(uVar48 * 9) * 2);
  uVar46 = *(undefined4 *)(prim + uVar41 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar44 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar44 >> 0x20),uVar98),uVar98);
  sVar56 = CONCAT11((char)uVar46,(char)uVar46);
  uVar47 = CONCAT62(uVar23,sVar56);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar47;
  auVar200._12_2_ = uVar99;
  auVar200._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar44 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar47;
  auVar199._10_2_ = uVar99;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar99;
  auVar198._0_8_ = uVar47;
  uVar99 = (undefined2)uVar23;
  auVar30._4_8_ = auVar198._8_8_;
  auVar30._2_2_ = uVar99;
  auVar30._0_2_ = uVar99;
  fVar226 = (float)((int)sVar56 >> 8);
  fVar237 = (float)(auVar30._0_4_ >> 0x18);
  fVar238 = (float)(auVar198._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar41 + uVar48 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar44 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar44 >> 0x20),uVar98),uVar98);
  sVar56 = CONCAT11((char)uVar46,(char)uVar46);
  uVar47 = CONCAT62(uVar23,sVar56);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar47;
  auVar203._12_2_ = uVar99;
  auVar203._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar44 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar47;
  auVar202._10_2_ = uVar99;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar99;
  auVar201._0_8_ = uVar47;
  uVar99 = (undefined2)uVar23;
  auVar31._4_8_ = auVar201._8_8_;
  auVar31._2_2_ = uVar99;
  auVar31._0_2_ = uVar99;
  fVar248 = (float)((int)sVar56 >> 8);
  fVar251 = (float)(auVar31._0_4_ >> 0x18);
  fVar252 = (float)(auVar201._8_4_ >> 0x18);
  uVar41 = (ulong)(uint)((int)(uVar48 * 5) << 2);
  uVar46 = *(undefined4 *)(prim + uVar41 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar44 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar44 >> 0x20),uVar98),uVar98);
  sVar56 = CONCAT11((char)uVar46,(char)uVar46);
  uVar47 = CONCAT62(uVar23,sVar56);
  auVar206._8_4_ = 0;
  auVar206._0_8_ = uVar47;
  auVar206._12_2_ = uVar99;
  auVar206._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar44 >> 0x20);
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar47;
  auVar205._10_2_ = uVar99;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._8_2_ = uVar99;
  auVar204._0_8_ = uVar47;
  uVar99 = (undefined2)uVar23;
  auVar32._4_8_ = auVar204._8_8_;
  auVar32._2_2_ = uVar99;
  auVar32._0_2_ = uVar99;
  fVar268 = (float)((int)sVar56 >> 8);
  fVar273 = (float)(auVar32._0_4_ >> 0x18);
  fVar274 = (float)(auVar204._8_4_ >> 0x18);
  fVar260 = fVar105 * fVar123 + fVar121 * fVar150 + fVar122 * fVar169;
  fVar265 = fVar105 * fVar133 + fVar121 * fVar167 + fVar122 * fVar178;
  fVar266 = fVar105 * fVar134 + fVar121 * fVar168 + fVar122 * fVar179;
  fVar267 = fVar105 * (float)(auVar241._12_4_ >> 0x18) +
            fVar121 * (float)(auVar59._12_4_ >> 0x18) + fVar122 * (float)(auVar62._12_4_ >> 0x18);
  fVar255 = fVar105 * fVar57 + fVar121 * fVar180 + fVar122 * fVar239;
  fVar257 = fVar105 * fVar100 + fVar121 * fVar192 + fVar122 * fVar246;
  fVar258 = fVar105 * fVar102 + fVar121 * fVar193 + fVar122 * fVar247;
  fVar259 = fVar105 * (float)(auVar65._12_4_ >> 0x18) +
            fVar121 * (float)(auVar182._12_4_ >> 0x18) + fVar122 * (float)(auVar196._12_4_ >> 0x18);
  fVar194 = fVar105 * fVar226 + fVar121 * fVar248 + fVar122 * fVar268;
  fVar224 = fVar105 * fVar237 + fVar121 * fVar251 + fVar122 * fVar273;
  fVar225 = fVar105 * fVar238 + fVar121 * fVar252 + fVar122 * fVar274;
  fVar122 = fVar105 * (float)(auVar199._12_4_ >> 0x18) +
            fVar121 * (float)(auVar202._12_4_ >> 0x18) + fVar122 * (float)(auVar205._12_4_ >> 0x18);
  fVar124 = fVar123 * fVar136 + fVar150 * fVar148 + fVar169 * fVar149;
  fVar178 = fVar133 * fVar136 + fVar167 * fVar148 + fVar178 * fVar149;
  fVar179 = fVar134 * fVar136 + fVar168 * fVar148 + fVar179 * fVar149;
  fVar135 = (float)(auVar241._12_4_ >> 0x18) * fVar136 +
            (float)(auVar59._12_4_ >> 0x18) * fVar148 + (float)(auVar62._12_4_ >> 0x18) * fVar149;
  fVar180 = fVar57 * fVar136 + fVar180 * fVar148 + fVar239 * fVar149;
  fVar192 = fVar100 * fVar136 + fVar192 * fVar148 + fVar246 * fVar149;
  fVar193 = fVar102 * fVar136 + fVar193 * fVar148 + fVar247 * fVar149;
  fVar239 = (float)(auVar65._12_4_ >> 0x18) * fVar136 +
            (float)(auVar182._12_4_ >> 0x18) * fVar148 + (float)(auVar196._12_4_ >> 0x18) * fVar149;
  fVar150 = fVar136 * fVar226 + fVar148 * fVar248 + fVar149 * fVar268;
  fVar167 = fVar136 * fVar237 + fVar148 * fVar251 + fVar149 * fVar273;
  fVar168 = fVar136 * fVar238 + fVar148 * fVar252 + fVar149 * fVar274;
  fVar169 = fVar136 * (float)(auVar199._12_4_ >> 0x18) +
            fVar148 * (float)(auVar202._12_4_ >> 0x18) + fVar149 * (float)(auVar205._12_4_ >> 0x18);
  uVar58 = (uint)DAT_01f7b6c0;
  uVar101 = DAT_01f7b6c0._4_4_;
  uVar103 = DAT_01f7b6c0._8_4_;
  uVar104 = DAT_01f7b6c0._12_4_;
  uVar52 = -(uint)(1e-18 <= (float)((uint)fVar260 & uVar58));
  uVar53 = -(uint)(1e-18 <= (float)((uint)fVar265 & uVar101));
  uVar54 = -(uint)(1e-18 <= (float)((uint)fVar266 & uVar103));
  uVar55 = -(uint)(1e-18 <= (float)((uint)fVar267 & uVar104));
  auVar261._0_4_ = (uint)fVar260 & uVar52;
  auVar261._4_4_ = (uint)fVar265 & uVar53;
  auVar261._8_4_ = (uint)fVar266 & uVar54;
  auVar261._12_4_ = (uint)fVar267 & uVar55;
  auVar137._0_8_ = CONCAT44(~uVar53,~uVar52) & 0x219392ef219392ef;
  auVar137._8_4_ = ~uVar54 & 0x219392ef;
  auVar137._12_4_ = ~uVar55 & 0x219392ef;
  auVar137 = auVar137 | auVar261;
  uVar52 = -(uint)(1e-18 <= (float)((uint)fVar255 & uVar58));
  uVar53 = -(uint)(1e-18 <= (float)((uint)fVar257 & uVar101));
  uVar54 = -(uint)(1e-18 <= (float)((uint)fVar258 & uVar103));
  uVar55 = -(uint)(1e-18 <= (float)((uint)fVar259 & uVar104));
  auVar256._0_4_ = (uint)fVar255 & uVar52;
  auVar256._4_4_ = (uint)fVar257 & uVar53;
  auVar256._8_4_ = (uint)fVar258 & uVar54;
  auVar256._12_4_ = (uint)fVar259 & uVar55;
  auVar151._0_8_ = CONCAT44(~uVar53,~uVar52) & 0x219392ef219392ef;
  auVar151._8_4_ = ~uVar54 & 0x219392ef;
  auVar151._12_4_ = ~uVar55 & 0x219392ef;
  auVar151 = auVar151 | auVar256;
  uVar52 = -(uint)(1e-18 <= (float)((uint)fVar194 & uVar58));
  uVar53 = -(uint)(1e-18 <= (float)((uint)fVar224 & uVar101));
  uVar54 = -(uint)(1e-18 <= (float)((uint)fVar225 & uVar103));
  uVar55 = -(uint)(1e-18 <= (float)((uint)fVar122 & uVar104));
  auVar207._0_4_ = (uint)fVar194 & uVar52;
  auVar207._4_4_ = (uint)fVar224 & uVar53;
  auVar207._8_4_ = (uint)fVar225 & uVar54;
  auVar207._12_4_ = (uint)fVar122 & uVar55;
  auVar184._0_8_ = CONCAT44(~uVar53,~uVar52) & 0x219392ef219392ef;
  auVar184._8_4_ = ~uVar54 & 0x219392ef;
  auVar184._12_4_ = ~uVar55 & 0x219392ef;
  auVar184 = auVar184 | auVar207;
  auVar67 = rcpps(_DAT_01f7b6c0,auVar137);
  fVar122 = auVar67._0_4_;
  fVar102 = auVar67._4_4_;
  fVar123 = auVar67._8_4_;
  fVar136 = auVar67._12_4_;
  fVar122 = (1.0 - auVar137._0_4_ * fVar122) * fVar122 + fVar122;
  fVar102 = (1.0 - auVar137._4_4_ * fVar102) * fVar102 + fVar102;
  fVar123 = (1.0 - auVar137._8_4_ * fVar123) * fVar123 + fVar123;
  fVar136 = (1.0 - auVar137._12_4_ * fVar136) * fVar136 + fVar136;
  auVar67 = rcpps(auVar67,auVar151);
  fVar57 = auVar67._0_4_;
  fVar105 = auVar67._4_4_;
  fVar133 = auVar67._8_4_;
  fVar148 = auVar67._12_4_;
  fVar57 = (1.0 - auVar151._0_4_ * fVar57) * fVar57 + fVar57;
  fVar105 = (1.0 - auVar151._4_4_ * fVar105) * fVar105 + fVar105;
  fVar133 = (1.0 - auVar151._8_4_ * fVar133) * fVar133 + fVar133;
  fVar148 = (1.0 - auVar151._12_4_ * fVar148) * fVar148 + fVar148;
  auVar67 = rcpps(auVar67,auVar184);
  fVar100 = auVar67._0_4_;
  fVar121 = auVar67._4_4_;
  fVar134 = auVar67._8_4_;
  fVar149 = auVar67._12_4_;
  fVar100 = (1.0 - auVar184._0_4_ * fVar100) * fVar100 + fVar100;
  fVar121 = (1.0 - auVar184._4_4_ * fVar121) * fVar121 + fVar121;
  fVar134 = (1.0 - auVar184._8_4_ * fVar134) * fVar134 + fVar134;
  fVar149 = (1.0 - auVar184._12_4_ * fVar149) * fVar149 + fVar149;
  uVar47 = *(ulong *)(prim + uVar48 * 7 + 6);
  uVar99 = (undefined2)(uVar47 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar47;
  auVar70._12_2_ = uVar99;
  auVar70._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar47 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar47;
  auVar69._10_2_ = uVar99;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar99;
  auVar68._0_8_ = uVar47;
  uVar99 = (undefined2)(uVar47 >> 0x10);
  auVar33._4_8_ = auVar68._8_8_;
  auVar33._2_2_ = uVar99;
  auVar33._0_2_ = uVar99;
  auVar138._0_8_ =
       CONCAT44(((float)(auVar33._0_4_ >> 0x10) - fVar178) * fVar102,
                ((float)(int)(short)uVar47 - fVar124) * fVar122);
  auVar138._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar179) * fVar123;
  auVar138._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar135) * fVar136;
  uVar47 = *(ulong *)(prim + uVar48 * 9 + 6);
  uVar99 = (undefined2)(uVar47 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar47;
  auVar73._12_2_ = uVar99;
  auVar73._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar47 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar47;
  auVar72._10_2_ = uVar99;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar99;
  auVar71._0_8_ = uVar47;
  uVar99 = (undefined2)(uVar47 >> 0x10);
  auVar34._4_8_ = auVar71._8_8_;
  auVar34._2_2_ = uVar99;
  auVar34._0_2_ = uVar99;
  auVar185._0_4_ = ((float)(int)(short)uVar47 - fVar124) * fVar122;
  auVar185._4_4_ = ((float)(auVar34._0_4_ >> 0x10) - fVar178) * fVar102;
  auVar185._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar179) * fVar123;
  auVar185._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar135) * fVar136;
  lVar42 = uVar41 + uVar48;
  uVar47 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar41 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar48 * -2 + 6);
  uVar99 = (undefined2)(uVar41 >> 0x30);
  auVar210._8_4_ = 0;
  auVar210._0_8_ = uVar41;
  auVar210._12_2_ = uVar99;
  auVar210._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar41 >> 0x20);
  auVar209._12_4_ = auVar210._12_4_;
  auVar209._8_2_ = 0;
  auVar209._0_8_ = uVar41;
  auVar209._10_2_ = uVar99;
  auVar208._10_6_ = auVar209._10_6_;
  auVar208._8_2_ = uVar99;
  auVar208._0_8_ = uVar41;
  uVar99 = (undefined2)(uVar41 >> 0x10);
  auVar35._4_8_ = auVar208._8_8_;
  auVar35._2_2_ = uVar99;
  auVar35._0_2_ = uVar99;
  auVar211._0_8_ =
       CONCAT44(((float)(auVar35._0_4_ >> 0x10) - fVar192) * fVar105,
                ((float)(int)(short)uVar41 - fVar180) * fVar57);
  auVar211._8_4_ = ((float)(auVar208._8_4_ >> 0x10) - fVar193) * fVar133;
  auVar211._12_4_ = ((float)(auVar209._12_4_ >> 0x10) - fVar239) * fVar148;
  uVar99 = (undefined2)(uVar47 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar47;
  auVar76._12_2_ = uVar99;
  auVar76._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar47 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar47;
  auVar75._10_2_ = uVar99;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar99;
  auVar74._0_8_ = uVar47;
  uVar99 = (undefined2)(uVar47 >> 0x10);
  auVar36._4_8_ = auVar74._8_8_;
  auVar36._2_2_ = uVar99;
  auVar36._0_2_ = uVar99;
  auVar77._0_4_ = ((float)(int)(short)uVar47 - fVar180) * fVar57;
  auVar77._4_4_ = ((float)(auVar36._0_4_ >> 0x10) - fVar192) * fVar105;
  auVar77._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar193) * fVar133;
  auVar77._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar239) * fVar148;
  uVar47 = *(ulong *)(prim + lVar42 + 6);
  uVar99 = (undefined2)(uVar47 >> 0x30);
  auVar172._8_4_ = 0;
  auVar172._0_8_ = uVar47;
  auVar172._12_2_ = uVar99;
  auVar172._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar47 >> 0x20);
  auVar171._12_4_ = auVar172._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar47;
  auVar171._10_2_ = uVar99;
  auVar170._10_6_ = auVar171._10_6_;
  auVar170._8_2_ = uVar99;
  auVar170._0_8_ = uVar47;
  uVar99 = (undefined2)(uVar47 >> 0x10);
  auVar37._4_8_ = auVar170._8_8_;
  auVar37._2_2_ = uVar99;
  auVar37._0_2_ = uVar99;
  auVar173._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar167) * fVar121,
                ((float)(int)(short)uVar47 - fVar150) * fVar100);
  auVar173._8_4_ = ((float)(auVar170._8_4_ >> 0x10) - fVar168) * fVar134;
  auVar173._12_4_ = ((float)(auVar171._12_4_ >> 0x10) - fVar169) * fVar149;
  uVar47 = *(ulong *)(prim + uVar48 * 0x17 + 6);
  uVar99 = (undefined2)(uVar47 >> 0x30);
  auVar229._8_4_ = 0;
  auVar229._0_8_ = uVar47;
  auVar229._12_2_ = uVar99;
  auVar229._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar47 >> 0x20);
  auVar228._12_4_ = auVar229._12_4_;
  auVar228._8_2_ = 0;
  auVar228._0_8_ = uVar47;
  auVar228._10_2_ = uVar99;
  auVar227._10_6_ = auVar228._10_6_;
  auVar227._8_2_ = uVar99;
  auVar227._0_8_ = uVar47;
  uVar99 = (undefined2)(uVar47 >> 0x10);
  auVar38._4_8_ = auVar227._8_8_;
  auVar38._2_2_ = uVar99;
  auVar38._0_2_ = uVar99;
  auVar230._0_4_ = ((float)(int)(short)uVar47 - fVar150) * fVar100;
  auVar230._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar167) * fVar121;
  auVar230._8_4_ = ((float)(auVar227._8_4_ >> 0x10) - fVar168) * fVar134;
  auVar230._12_4_ = ((float)(auVar228._12_4_ >> 0x10) - fVar169) * fVar149;
  auVar240._8_4_ = auVar138._8_4_;
  auVar240._0_8_ = auVar138._0_8_;
  auVar240._12_4_ = auVar138._12_4_;
  auVar241 = minps(auVar240,auVar185);
  auVar106._8_4_ = auVar211._8_4_;
  auVar106._0_8_ = auVar211._0_8_;
  auVar106._12_4_ = auVar211._12_4_;
  auVar67 = minps(auVar106,auVar77);
  auVar241 = maxps(auVar241,auVar67);
  auVar107._8_4_ = auVar173._8_4_;
  auVar107._0_8_ = auVar173._0_8_;
  auVar107._12_4_ = auVar173._12_4_;
  auVar67 = minps(auVar107,auVar230);
  uVar46 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar152._4_4_ = uVar46;
  auVar152._0_4_ = uVar46;
  auVar152._8_4_ = uVar46;
  auVar152._12_4_ = uVar46;
  auVar67 = maxps(auVar67,auVar152);
  auVar67 = maxps(auVar241,auVar67);
  local_1c8 = auVar67._0_4_ * 0.99999964;
  fStack_1c4 = auVar67._4_4_ * 0.99999964;
  fStack_1c0 = auVar67._8_4_ * 0.99999964;
  fStack_1bc = auVar67._12_4_ * 0.99999964;
  auVar67 = maxps(auVar138,auVar185);
  auVar241 = maxps(auVar211,auVar77);
  auVar67 = minps(auVar67,auVar241);
  auVar241 = maxps(auVar173,auVar230);
  fVar122 = ray->tfar;
  auVar78._4_4_ = fVar122;
  auVar78._0_4_ = fVar122;
  auVar78._8_4_ = fVar122;
  auVar78._12_4_ = fVar122;
  auVar241 = minps(auVar241,auVar78);
  auVar67 = minps(auVar67,auVar241);
  auVar108._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && local_1c8 <= auVar67._0_4_ * 1.0000004);
  auVar108._4_4_ = -(uint)(1 < (byte)PVar6 && fStack_1c4 <= auVar67._4_4_ * 1.0000004);
  auVar108._8_4_ = -(uint)(2 < (byte)PVar6 && fStack_1c0 <= auVar67._8_4_ * 1.0000004);
  auVar108._12_4_ = -(uint)(3 < (byte)PVar6 && fStack_1bc <= auVar67._12_4_ * 1.0000004);
  uVar52 = movmskps((int)lVar42,auVar108);
  if (uVar52 == 0) {
    return false;
  }
  uVar52 = uVar52 & 0xff;
  local_188._0_12_ = mm_lookupmask_ps._240_12_;
  local_188._12_4_ = 0;
  local_378 = prim;
LAB_00a79ef5:
  uVar47 = (ulong)uVar52;
  lVar42 = 0;
  if (uVar47 != 0) {
    for (; (uVar52 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
    }
  }
  uVar47 = uVar47 - 1 & uVar47;
  uVar52 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar52].ptr;
  uVar41 = *(ulong *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  local_370 = (ulong)*(uint *)(prim + lVar42 * 4 + 6);
  uVar48 = (ulong)*(uint *)(uVar41 + _Var8 * *(uint *)(prim + lVar42 * 4 + 6));
  p_Var43 = pGVar7[1].intersectionFilterN;
  lVar42 = 0;
  if (uVar47 != 0) {
    for (; (uVar47 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
    }
  }
  lVar42 = *(long *)&pGVar7[1].time_range.upper;
  pfVar1 = (float *)(lVar42 + (long)p_Var43 * uVar48);
  pfVar2 = (float *)(lVar42 + (uVar48 + 1) * (long)p_Var43);
  pfVar3 = (float *)(lVar42 + (uVar48 + 2) * (long)p_Var43);
  pfVar4 = (float *)(lVar42 + (uVar48 + 3) * (long)p_Var43);
  if ((uVar47 != 0) && (uVar48 = uVar47 - 1 & uVar47, uVar48 != 0)) {
    lVar42 = 0;
    if (uVar48 != 0) {
      for (; (uVar48 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
      }
    }
    uVar41 = (ulong)*(uint *)(uVar41 + _Var8 * *(uint *)(prim + lVar42 * 4 + 6));
  }
  local_358 = (ray->org).field_0.m128[0];
  fVar122 = (ray->org).field_0.m128[1];
  fVar57 = (ray->org).field_0.m128[2];
  local_368 = (ray->dir).field_0.m128[0];
  local_438 = (ray->dir).field_0.m128[1];
  local_4b8 = (ray->dir).field_0.m128[2];
  fVar100 = (ray->dir).field_0.m128[3];
  fStack_13c = local_368 * local_368;
  fVar105 = local_438 * local_438;
  fVar121 = local_4b8 * local_4b8;
  fVar100 = fVar100 * fVar100;
  fVar102 = fStack_13c + fVar105 + fVar121;
  auVar153._0_8_ = CONCAT44(fVar105 + fVar105 + fVar100,fVar102);
  auVar153._8_4_ = fVar121 + fVar105 + fVar121;
  auVar153._12_4_ = fVar100 + fVar105 + fVar100;
  auVar139._8_4_ = auVar153._8_4_;
  auVar139._0_8_ = auVar153._0_8_;
  auVar139._12_4_ = auVar153._12_4_;
  auVar67 = rcpss(auVar139,auVar153);
  fVar100 = (2.0 - fVar102 * auVar67._0_4_) * auVar67._0_4_ *
            (((pfVar1[2] + pfVar2[2]) * 0.5 - fVar57) * local_4b8 +
            ((pfVar1[1] + pfVar2[1]) * 0.5 - fVar122) * local_438 +
            ((*pfVar1 + *pfVar2) * 0.5 - local_358) * local_368);
  local_2e8 = ZEXT416((uint)fVar100);
  local_358 = local_368 * fVar100 + local_358;
  fVar122 = local_438 * fVar100 + fVar122;
  fVar57 = local_4b8 * fVar100 + fVar57;
  local_328 = *pfVar1 - local_358;
  local_158 = pfVar1[1] - fVar122;
  local_208 = pfVar1[2] - fVar57;
  fStack_31c = pfVar1[3] - 0.0;
  fVar102 = *pfVar3 - local_358;
  local_268 = pfVar3[1] - fVar122;
  local_278 = pfVar3[2] - fVar57;
  fStack_33c = pfVar3[3] - 0.0;
  local_228 = *pfVar2 - local_358;
  local_238 = pfVar2[1] - fVar122;
  local_248 = pfVar2[2] - fVar57;
  fStack_32c = pfVar2[3] - 0.0;
  local_358 = *pfVar4 - local_358;
  fVar122 = pfVar4[1] - fVar122;
  fVar57 = pfVar4[2] - fVar57;
  fStack_34c = pfVar4[3] - 0.0;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  fStack_204 = local_208;
  fStack_200 = local_208;
  fStack_1fc = local_208;
  fStack_324 = local_158;
  fStack_320 = local_208;
  local_218 = fStack_31c;
  fStack_214 = fStack_31c;
  fStack_210 = fStack_31c;
  fStack_20c = fStack_31c;
  fStack_224 = local_228;
  fStack_220 = local_228;
  fStack_21c = local_228;
  fStack_234 = local_238;
  fStack_230 = local_238;
  fStack_22c = local_238;
  fStack_244 = local_248;
  fStack_240 = local_248;
  fStack_23c = local_248;
  local_338 = local_228;
  fStack_334 = local_238;
  fStack_330 = local_248;
  local_258 = fStack_32c;
  fStack_254 = fStack_32c;
  fStack_250 = fStack_32c;
  fStack_24c = fStack_32c;
  fStack_264 = local_268;
  fStack_260 = local_268;
  fStack_25c = local_268;
  fStack_274 = local_278;
  fStack_270 = local_278;
  fStack_26c = local_278;
  local_148 = fStack_13c + fVar121 + fVar105;
  fStack_144 = fStack_13c + fVar121 + fVar105;
  fStack_140 = fStack_13c + fVar121 + fVar105;
  fStack_13c = fStack_13c + fVar121 + fVar105;
  local_348 = fVar102;
  fStack_344 = local_268;
  fStack_340 = local_278;
  local_288 = fStack_33c;
  fStack_284 = fStack_33c;
  fStack_280 = fStack_33c;
  fStack_27c = fStack_33c;
  fStack_354 = fVar122;
  fStack_350 = fVar57;
  local_298 = fStack_34c;
  fStack_294 = fStack_34c;
  fStack_290 = fStack_34c;
  fStack_28c = fStack_34c;
  fStack_364 = local_368;
  fStack_360 = local_368;
  fStack_35c = local_368;
  fStack_434 = local_438;
  fStack_430 = local_438;
  fStack_42c = local_438;
  local_2b8 = ABS(local_148);
  fStack_2b4 = ABS(fStack_144);
  fStack_2b0 = ABS(fStack_140);
  fStack_2ac = ABS(fStack_13c);
  local_57c = 1;
  uVar48 = 0;
  bVar49 = false;
  local_178 = 0.0;
  fStack_174 = 1.0;
  local_1f8 = local_328;
  fStack_1f4 = local_328;
  fStack_1f0 = local_328;
  fStack_1ec = local_328;
  local_2a8 = local_358;
  fStack_2a4 = local_358;
  fStack_2a0 = local_358;
  fStack_29c = local_358;
  fStack_4b4 = local_4b8;
  fStack_4b0 = local_4b8;
  fStack_4ac = local_4b8;
  do {
    iVar50 = (int)uVar48;
    local_408._4_4_ = fStack_174 - local_178;
    uStack_170 = 0;
    uStack_16c = 0;
    local_408._0_4_ = local_408._4_4_;
    fStack_400 = (float)local_408._4_4_;
    fStack_3fc = (float)local_408._4_4_;
    local_418 = local_178;
    fStack_414 = local_178;
    fStack_410 = local_178;
    fStack_40c = local_178;
    fVar136 = (float)local_408._4_4_ * 0.0 + local_178;
    fVar149 = (float)local_408._4_4_ * 0.33333334 + local_178;
    fVar167 = (float)local_408._4_4_ * 0.6666667 + local_178;
    fVar169 = (float)local_408._4_4_ * 1.0 + local_178;
    fVar194 = 1.0 - fVar136;
    fVar225 = 1.0 - fVar149;
    fVar237 = 1.0 - fVar167;
    fVar247 = 1.0 - fVar169;
    fVar105 = fVar136 * 3.0;
    fVar121 = fVar149 * 3.0;
    fVar123 = fVar167 * 3.0;
    fVar133 = fVar169 * 3.0;
    fVar178 = ((fVar194 * 3.0 + -5.0) * fVar194 * fVar194 + 2.0) * 0.5;
    fVar179 = ((fVar225 * 3.0 + -5.0) * fVar225 * fVar225 + 2.0) * 0.5;
    fVar239 = ((fVar237 * 3.0 + -5.0) * fVar237 * fVar237 + 2.0) * 0.5;
    fVar246 = ((fVar247 * 3.0 + -5.0) * fVar247 * fVar247 + 2.0) * 0.5;
    fVar148 = -fVar194 * fVar136 * fVar136 * 0.5;
    fVar168 = -fVar225 * fVar149 * fVar149 * 0.5;
    fVar135 = -fVar237 * fVar167 * fVar167 * 0.5;
    fVar192 = -fVar247 * fVar169 * fVar169 * 0.5;
    fVar251 = (fVar136 * fVar136 * (fVar105 + -5.0) + 2.0) * 0.5;
    fVar252 = (fVar149 * fVar149 * (fVar121 + -5.0) + 2.0) * 0.5;
    fVar255 = (fVar167 * fVar167 * (fVar123 + -5.0) + 2.0) * 0.5;
    fVar257 = (fVar169 * fVar169 * (fVar133 + -5.0) + 2.0) * 0.5;
    fVar134 = (float)local_408._4_4_ * 0.11111111;
    fVar150 = -fVar136 * fVar194 * fVar194 * 0.5;
    fVar124 = -fVar149 * fVar225 * fVar225 * 0.5;
    fVar180 = -fVar167 * fVar237 * fVar237 * 0.5;
    fVar193 = -fVar169 * fVar247 * fVar247 * 0.5;
    fVar267 = local_1f8 * fVar150 + local_228 * fVar251 + fVar102 * fVar178 + local_2a8 * fVar148;
    fVar268 = fStack_1f4 * fVar124 + fStack_224 * fVar252 + fVar102 * fVar179 + fStack_2a4 * fVar168
    ;
    fVar273 = fStack_1f0 * fVar180 + fStack_220 * fVar255 + fVar102 * fVar239 + fStack_2a0 * fVar135
    ;
    fVar274 = fStack_1ec * fVar193 + fStack_21c * fVar257 + fVar102 * fVar246 + fStack_29c * fVar192
    ;
    fVar224 = local_158 * fVar150 + local_238 * fVar251 + local_268 * fVar178 + fVar122 * fVar148;
    fVar226 = fStack_154 * fVar124 + fStack_234 * fVar252 + fStack_264 * fVar179 + fVar122 * fVar168
    ;
    fVar238 = fStack_150 * fVar180 + fStack_230 * fVar255 + fStack_260 * fVar239 + fVar122 * fVar135
    ;
    fVar248 = fStack_14c * fVar193 + fStack_22c * fVar257 + fStack_25c * fVar246 + fVar122 * fVar192
    ;
    fVar259 = local_208 * fVar150 + local_248 * fVar251 + local_278 * fVar178 + fVar57 * fVar148;
    fVar260 = fStack_204 * fVar124 + fStack_244 * fVar252 + fStack_274 * fVar179 + fVar57 * fVar168;
    fVar265 = fStack_200 * fVar180 + fStack_240 * fVar255 + fStack_270 * fVar239 + fVar57 * fVar135;
    fVar266 = fStack_1fc * fVar193 + fStack_23c * fVar257 + fStack_26c * fVar246 + fVar57 * fVar192;
    fVar178 = fVar150 * local_218 + fVar251 * local_258 + fVar178 * local_288 + fVar148 * local_298;
    fVar179 = fVar124 * fStack_214 +
              fVar252 * fStack_254 + fVar179 * fStack_284 + fVar168 * fStack_294;
    auVar174._0_8_ = CONCAT44(fVar179,fVar178);
    auVar174._8_4_ =
         fVar180 * fStack_210 + fVar255 * fStack_250 + fVar239 * fStack_280 + fVar135 * fStack_290;
    auVar174._12_4_ =
         fVar193 * fStack_20c + fVar257 * fStack_24c + fVar246 * fStack_27c + fVar192 * fStack_28c;
    fVar135 = fVar136 * (fVar194 + fVar194);
    fVar192 = fVar149 * (fVar225 + fVar225);
    fVar239 = fVar167 * (fVar237 + fVar237);
    fVar251 = fVar169 * (fVar247 + fVar247);
    fVar180 = (fVar135 - fVar194 * fVar194) * 0.5;
    fVar193 = (fVar192 - fVar225 * fVar225) * 0.5;
    fVar246 = (fVar239 - fVar237 * fVar237) * 0.5;
    fVar252 = (fVar251 - fVar247 * fVar247) * 0.5;
    fVar148 = (fVar136 * fVar105 + (fVar136 + fVar136) * (fVar105 + -5.0)) * 0.5;
    fVar150 = (fVar149 * fVar121 + (fVar149 + fVar149) * (fVar121 + -5.0)) * 0.5;
    fVar168 = (fVar167 * fVar123 + (fVar167 + fVar167) * (fVar123 + -5.0)) * 0.5;
    fVar124 = (fVar169 * fVar133 + (fVar169 + fVar169) * (fVar133 + -5.0)) * 0.5;
    fVar105 = ((fVar105 + 2.0) * (fVar194 + fVar194) - fVar194 * 3.0 * fVar194) * 0.5;
    fVar121 = ((fVar121 + 2.0) * (fVar225 + fVar225) - fVar225 * 3.0 * fVar225) * 0.5;
    fVar123 = ((fVar123 + 2.0) * (fVar237 + fVar237) - fVar237 * 3.0 * fVar237) * 0.5;
    fVar133 = ((fVar133 + 2.0) * (fVar247 + fVar247) - fVar247 * 3.0 * fVar247) * 0.5;
    fVar136 = (fVar136 * fVar136 - fVar135) * 0.5;
    fVar149 = (fVar149 * fVar149 - fVar192) * 0.5;
    fVar167 = (fVar167 * fVar167 - fVar239) * 0.5;
    fVar169 = (fVar169 * fVar169 - fVar251) * 0.5;
    local_3f8 = (local_1f8 * fVar180 + local_228 * fVar148 + fVar102 * fVar105 + local_2a8 * fVar136
                ) * fVar134;
    fStack_3f4 = (fStack_1f4 * fVar193 +
                 fStack_224 * fVar150 + fVar102 * fVar121 + fStack_2a4 * fVar149) * fVar134;
    fStack_3f0 = (fStack_1f0 * fVar246 +
                 fStack_220 * fVar168 + fVar102 * fVar123 + fStack_2a0 * fVar167) * fVar134;
    fStack_3ec = (fStack_1ec * fVar252 +
                 fStack_21c * fVar124 + fVar102 * fVar133 + fStack_29c * fVar169) * fVar134;
    fVar225 = (local_158 * fVar180 + local_238 * fVar148 + local_268 * fVar105 + fVar122 * fVar136)
              * fVar134;
    fVar239 = (fStack_154 * fVar193 +
              fStack_234 * fVar150 + fStack_264 * fVar121 + fVar122 * fVar149) * fVar134;
    local_398 = (undefined1  [8])CONCAT44(fVar239,fVar225);
    fStack_390 = (fStack_150 * fVar246 +
                 fStack_230 * fVar168 + fStack_260 * fVar123 + fVar122 * fVar167) * fVar134;
    fStack_38c = (fStack_14c * fVar252 +
                 fStack_22c * fVar124 + fStack_25c * fVar133 + fVar122 * fVar169) * fVar134;
    local_3a8 = (local_208 * fVar180 + local_248 * fVar148 + local_278 * fVar105 + fVar57 * fVar136)
                * fVar134;
    fStack_3a4 = (fStack_204 * fVar193 +
                 fStack_244 * fVar150 + fStack_274 * fVar121 + fVar57 * fVar149) * fVar134;
    fStack_3a0 = (fStack_200 * fVar246 +
                 fStack_240 * fVar168 + fStack_270 * fVar123 + fVar57 * fVar167) * fVar134;
    fStack_39c = (fStack_1fc * fVar252 +
                 fStack_23c * fVar124 + fStack_26c * fVar133 + fVar57 * fVar169) * fVar134;
    fVar121 = fVar134 * (fVar193 * fStack_214 +
                        fVar150 * fStack_254 + fVar121 * fStack_284 + fVar149 * fStack_294);
    fVar123 = fVar134 * (fVar246 * fStack_210 +
                        fVar168 * fStack_250 + fVar123 * fStack_280 + fVar167 * fStack_290);
    fVar133 = fVar134 * (fVar252 * fStack_20c +
                        fVar124 * fStack_24c + fVar133 * fStack_27c + fVar169 * fStack_28c);
    auVar262._4_4_ = auVar174._8_4_;
    auVar262._0_4_ = fVar179;
    auVar262._8_4_ = auVar174._12_4_;
    auVar262._12_4_ = 0;
    local_558._4_4_ = fVar179 + fVar121;
    local_558._0_4_ =
         fVar178 + fVar134 * (fVar180 * local_218 +
                             fVar148 * local_258 + fVar105 * local_288 + fVar136 * local_298);
    fStack_550 = auVar174._8_4_ + fVar123;
    fStack_54c = auVar174._12_4_ + fVar133;
    auVar186._0_8_ = CONCAT44(auVar174._8_4_ - fVar123,fVar179 - fVar121);
    auVar186._8_4_ = auVar174._12_4_ - fVar133;
    auVar186._12_4_ = 0;
    local_458._0_4_ = fVar226 - fVar224;
    local_458._4_4_ = fVar238 - fVar226;
    fStack_450 = fVar248 - fVar238;
    fStack_44c = 0.0 - fVar248;
    local_2f8._0_4_ = fVar260 - fVar259;
    local_2f8._4_4_ = fVar265 - fVar260;
    fStack_2f0 = fVar266 - fVar265;
    fStack_2ec = 0.0 - fVar266;
    fVar134 = fVar225 * (float)local_2f8._0_4_ - local_3a8 * (float)local_458._0_4_;
    fVar136 = fVar239 * (float)local_2f8._4_4_ - fStack_3a4 * (float)local_458._4_4_;
    fVar148 = fStack_390 * fStack_2f0 - fStack_3a0 * fStack_450;
    fVar149 = fStack_38c * fStack_2ec - fStack_39c * fStack_44c;
    local_308._0_4_ = fVar268 - fVar267;
    local_308._4_4_ = fVar273 - fVar268;
    fStack_300 = fVar274 - fVar273;
    fStack_2fc = 0.0 - fVar274;
    fVar150 = local_3a8 * (float)local_308._0_4_ - local_3f8 * (float)local_2f8._0_4_;
    fVar167 = fStack_3a4 * (float)local_308._4_4_ - fStack_3f4 * (float)local_2f8._4_4_;
    fVar168 = fStack_3a0 * fStack_300 - fStack_3f0 * fStack_2f0;
    fVar169 = fStack_39c * fStack_2fc - fStack_3ec * fStack_2ec;
    fVar124 = local_3f8 * (float)local_458._0_4_ - fVar225 * (float)local_308._0_4_;
    fVar178 = fStack_3f4 * (float)local_458._4_4_ - fVar239 * (float)local_308._4_4_;
    fVar179 = fStack_3f0 * fStack_450 - fStack_390 * fStack_300;
    fVar135 = fStack_3ec * fStack_44c - fStack_38c * fStack_2fc;
    auVar231._0_4_ =
         (float)local_458._0_4_ * (float)local_458._0_4_ +
         (float)local_2f8._0_4_ * (float)local_2f8._0_4_;
    auVar231._4_4_ =
         (float)local_458._4_4_ * (float)local_458._4_4_ +
         (float)local_2f8._4_4_ * (float)local_2f8._4_4_;
    auVar231._8_4_ = fStack_450 * fStack_450 + fStack_2f0 * fStack_2f0;
    auVar231._12_4_ = fStack_44c * fStack_44c + fStack_2ec * fStack_2ec;
    auVar212._0_4_ = (float)local_308._0_4_ * (float)local_308._0_4_ + auVar231._0_4_;
    auVar212._4_4_ = (float)local_308._4_4_ * (float)local_308._4_4_ + auVar231._4_4_;
    auVar212._8_4_ = fStack_300 * fStack_300 + auVar231._8_4_;
    auVar212._12_4_ = fStack_2fc * fStack_2fc + auVar231._12_4_;
    auVar67 = rcpps(auVar231,auVar212);
    fVar105 = auVar67._0_4_;
    fVar121 = auVar67._4_4_;
    fVar123 = auVar67._8_4_;
    fVar133 = auVar67._12_4_;
    fVar105 = (1.0 - fVar105 * auVar212._0_4_) * fVar105 + fVar105;
    fVar121 = (1.0 - fVar121 * auVar212._4_4_) * fVar121 + fVar121;
    fVar123 = (1.0 - fVar123 * auVar212._8_4_) * fVar123 + fVar123;
    fVar133 = (1.0 - fVar133 * auVar212._12_4_) * fVar133 + fVar133;
    auVar125._8_4_ = fStack_390;
    auVar125._0_8_ = local_398;
    auVar125._12_4_ = fStack_38c;
    fVar180 = (float)local_2f8._0_4_ * fVar239 - (float)local_458._0_4_ * fStack_3a4;
    fVar192 = (float)local_2f8._4_4_ * fStack_390 - (float)local_458._4_4_ * fStack_3a0;
    fVar193 = fStack_2f0 * fStack_38c - fStack_450 * fStack_39c;
    fVar194 = fStack_2ec * 0.0 - fStack_44c * 0.0;
    local_3d8 = fStack_3a4;
    fStack_3d4 = fStack_3a0;
    fStack_3d0 = fStack_39c;
    fStack_3cc = 0.0;
    fVar237 = (float)local_308._0_4_ * fStack_3a4 - (float)local_2f8._0_4_ * fStack_3f4;
    fVar246 = (float)local_308._4_4_ * fStack_3a0 - (float)local_2f8._4_4_ * fStack_3f0;
    fVar247 = fStack_300 * fStack_39c - fStack_2f0 * fStack_3ec;
    fVar251 = fStack_2fc * 0.0 - fStack_2ec * 0.0;
    local_3c8 = auVar125 >> 0x20;
    local_3b8 = fStack_3f4;
    fStack_3b4 = fStack_3f0;
    fStack_3b0 = fStack_3ec;
    fStack_3ac = 0.0;
    fVar252 = (float)local_458._0_4_ * fStack_3f4 - (float)local_308._0_4_ * fVar239;
    fVar255 = (float)local_458._4_4_ * fStack_3f0 - (float)local_308._4_4_ * fStack_390;
    fVar257 = fStack_450 * fStack_3ec - fStack_300 * fStack_38c;
    fVar258 = fStack_44c * 0.0 - fStack_2fc * 0.0;
    auVar154._0_4_ = (fVar134 * fVar134 + fVar150 * fVar150 + fVar124 * fVar124) * fVar105;
    auVar154._4_4_ = (fVar136 * fVar136 + fVar167 * fVar167 + fVar178 * fVar178) * fVar121;
    auVar154._8_4_ = (fVar148 * fVar148 + fVar168 * fVar168 + fVar179 * fVar179) * fVar123;
    auVar154._12_4_ = (fVar149 * fVar149 + fVar169 * fVar169 + fVar135 * fVar135) * fVar133;
    auVar242._0_4_ = (fVar180 * fVar180 + fVar237 * fVar237 + fVar252 * fVar252) * fVar105;
    auVar242._4_4_ = (fVar192 * fVar192 + fVar246 * fVar246 + fVar255 * fVar255) * fVar121;
    auVar242._8_4_ = (fVar193 * fVar193 + fVar247 * fVar247 + fVar257 * fVar257) * fVar123;
    auVar242._12_4_ = (fVar194 * fVar194 + fVar251 * fVar251 + fVar258 * fVar258) * fVar133;
    auVar241 = maxps(auVar154,auVar242);
    auVar109._8_4_ = auVar174._8_4_;
    auVar109._0_8_ = auVar174._0_8_;
    auVar109._12_4_ = auVar174._12_4_;
    auVar67 = maxps(auVar109,_local_558);
    auVar232._8_4_ = auVar186._8_4_;
    auVar232._0_8_ = auVar186._0_8_;
    auVar232._12_4_ = 0;
    auVar233 = maxps(auVar232,auVar262);
    auVar67 = maxps(auVar67,auVar233);
    auVar233 = minps(auVar174,_local_558);
    auVar187 = minps(auVar186,auVar262);
    auVar187 = minps(auVar233,auVar187);
    auVar241 = sqrtps(auVar125 >> 0x20,auVar241);
    auVar233 = rsqrtps(auVar241,auVar212);
    fVar105 = auVar233._0_4_;
    fVar121 = auVar233._4_4_;
    fVar123 = auVar233._8_4_;
    fVar133 = auVar233._12_4_;
    fVar124 = fVar105 * 1.5 - fVar105 * fVar105 * auVar212._0_4_ * 0.5 * fVar105;
    fVar178 = fVar121 * 1.5 - fVar121 * fVar121 * auVar212._4_4_ * 0.5 * fVar121;
    auVar249._0_8_ = CONCAT44(fVar178,fVar124);
    auVar249._8_4_ = fVar123 * 1.5 - fVar123 * fVar123 * auVar212._8_4_ * 0.5 * fVar123;
    auVar249._12_4_ = fVar133 * 1.5 - fVar133 * fVar133 * auVar212._12_4_ * 0.5 * fVar133;
    fVar150 = 0.0 - fVar224;
    fVar167 = 0.0 - fVar226;
    fVar168 = 0.0 - fVar238;
    fVar169 = 0.0 - fVar248;
    local_3e8 = 0.0 - fVar259;
    fStack_3e4 = 0.0 - fVar260;
    fStack_3e0 = 0.0 - fVar265;
    fStack_3dc = 0.0 - fVar266;
    fVar193 = 0.0 - fVar267;
    fVar194 = 0.0 - fVar268;
    fVar237 = 0.0 - fVar273;
    fVar246 = 0.0 - fVar274;
    local_1a8._8_4_ = auVar249._8_4_;
    local_1a8._0_8_ = auVar249._0_8_;
    local_1a8._12_4_ = auVar249._12_4_;
    local_318 = local_368 * (float)local_308._0_4_ * fVar124 +
                local_438 * (float)local_458._0_4_ * fVar124 +
                local_4b8 * (float)local_2f8._0_4_ * fVar124;
    fStack_314 = fStack_364 * (float)local_308._4_4_ * fVar178 +
                 fStack_434 * (float)local_458._4_4_ * fVar178 +
                 fStack_4b4 * (float)local_2f8._4_4_ * fVar178;
    fStack_310 = fStack_360 * fStack_300 * auVar249._8_4_ +
                 fStack_430 * fStack_450 * auVar249._8_4_ + fStack_4b0 * fStack_2f0 * auVar249._8_4_
    ;
    fStack_30c = fStack_35c * fStack_2fc * auVar249._12_4_ +
                 fStack_42c * fStack_44c * auVar249._12_4_ +
                 fStack_4ac * fStack_2ec * auVar249._12_4_;
    local_1b8 = (float)local_308._0_4_ * fVar124 * fVar193 +
                (float)local_458._0_4_ * fVar124 * fVar150 +
                (float)local_2f8._0_4_ * fVar124 * local_3e8;
    fStack_1b4 = (float)local_308._4_4_ * fVar178 * fVar194 +
                 (float)local_458._4_4_ * fVar178 * fVar167 +
                 (float)local_2f8._4_4_ * fVar178 * fStack_3e4;
    fStack_1b0 = fStack_300 * auVar249._8_4_ * fVar237 +
                 fStack_450 * auVar249._8_4_ * fVar168 + fStack_2f0 * auVar249._8_4_ * fStack_3e0;
    fStack_1ac = fStack_2fc * auVar249._12_4_ * fVar246 +
                 fStack_44c * auVar249._12_4_ * fVar169 + fStack_2ec * auVar249._12_4_ * fStack_3dc;
    fVar179 = (local_368 * fVar193 + local_438 * fVar150 + local_4b8 * local_3e8) -
              local_318 * local_1b8;
    fVar135 = (fStack_364 * fVar194 + fStack_434 * fVar167 + fStack_4b4 * fStack_3e4) -
              fStack_314 * fStack_1b4;
    fVar180 = (fStack_360 * fVar237 + fStack_430 * fVar168 + fStack_4b0 * fStack_3e0) -
              fStack_310 * fStack_1b0;
    fVar192 = (fStack_35c * fVar246 + fStack_42c * fVar169 + fStack_4ac * fStack_3dc) -
              fStack_30c * fStack_1ac;
    fVar134 = (fVar193 * fVar193 + fVar150 * fVar150 + local_3e8 * local_3e8) -
              local_1b8 * local_1b8;
    fVar136 = (fVar194 * fVar194 + fVar167 * fVar167 + fStack_3e4 * fStack_3e4) -
              fStack_1b4 * fStack_1b4;
    fVar148 = (fVar237 * fVar237 + fVar168 * fVar168 + fStack_3e0 * fStack_3e0) -
              fStack_1b0 * fStack_1b0;
    fVar149 = (fVar246 * fVar246 + fVar169 * fVar169 + fStack_3dc * fStack_3dc) -
              fStack_1ac * fStack_1ac;
    fVar105 = (auVar67._0_4_ + auVar241._0_4_) * 1.0000002;
    fVar121 = (auVar67._4_4_ + auVar241._4_4_) * 1.0000002;
    fVar123 = (auVar67._8_4_ + auVar241._8_4_) * 1.0000002;
    fVar133 = (auVar67._12_4_ + auVar241._12_4_) * 1.0000002;
    auVar188._0_4_ = fVar134 - fVar105 * fVar105;
    auVar188._4_4_ = fVar136 - fVar121 * fVar121;
    auVar188._8_4_ = fVar148 - fVar123 * fVar123;
    auVar188._12_4_ = fVar149 - fVar133 * fVar133;
    local_168 = local_318 * local_318;
    fStack_164 = fStack_314 * fStack_314;
    fStack_160 = fStack_310 * fStack_310;
    fStack_15c = fStack_30c * fStack_30c;
    local_2c8 = local_148 - local_168;
    fStack_2c4 = fStack_144 - fStack_164;
    fStack_2c0 = fStack_140 - fStack_160;
    fStack_2bc = fStack_13c - fStack_15c;
    fVar179 = fVar179 + fVar179;
    fVar135 = fVar135 + fVar135;
    fVar180 = fVar180 + fVar180;
    fVar192 = fVar192 + fVar192;
    local_428 = local_2c8 * 4.0;
    fStack_424 = fStack_2c4 * 4.0;
    fStack_420 = fStack_2c0 * 4.0;
    fStack_41c = fStack_2bc * 4.0;
    auVar110._0_4_ = fVar179 * fVar179 - local_428 * auVar188._0_4_;
    auVar110._4_4_ = fVar135 * fVar135 - fStack_424 * auVar188._4_4_;
    auVar110._8_4_ = fVar180 * fVar180 - fStack_420 * auVar188._8_4_;
    auVar110._12_4_ = fVar192 * fVar192 - fStack_41c * auVar188._12_4_;
    local_448._4_4_ = (auVar187._4_4_ - auVar241._4_4_) * 0.99999976;
    local_448._0_4_ = (auVar187._0_4_ - auVar241._0_4_) * 0.99999976;
    fStack_440 = (auVar187._8_4_ - auVar241._8_4_) * 0.99999976;
    fStack_43c = (auVar187._12_4_ - auVar241._12_4_) * 0.99999976;
    auVar126._4_4_ = -(uint)(0.0 <= auVar110._4_4_);
    auVar126._0_4_ = -(uint)(0.0 <= auVar110._0_4_);
    auVar126._8_4_ = -(uint)(0.0 <= auVar110._8_4_);
    auVar126._12_4_ = -(uint)(0.0 <= auVar110._12_4_);
    uVar46 = (undefined4)(uVar41 >> 0x20);
    iVar39 = movmskps((int)uVar41,auVar126);
    if (iVar39 == 0) {
      iVar39 = 0;
      auVar189 = _DAT_01f7aa00;
      auVar213 = _DAT_01f7a9f0;
    }
    else {
      auVar241 = sqrtps(auVar249,auVar110);
      bVar51 = 0.0 <= auVar110._0_4_;
      uVar53 = -(uint)bVar51;
      bVar9 = 0.0 <= auVar110._4_4_;
      uVar54 = -(uint)bVar9;
      bVar10 = 0.0 <= auVar110._8_4_;
      uVar55 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar110._12_4_;
      uVar58 = -(uint)bVar11;
      auVar155._0_4_ = local_2c8 + local_2c8;
      auVar155._4_4_ = fStack_2c4 + fStack_2c4;
      auVar155._8_4_ = fStack_2c0 + fStack_2c0;
      auVar155._12_4_ = fStack_2bc + fStack_2bc;
      auVar67 = rcpps(auVar188,auVar155);
      fVar247 = auVar67._0_4_;
      fVar251 = auVar67._4_4_;
      fVar252 = auVar67._8_4_;
      fVar255 = auVar67._12_4_;
      fVar247 = (1.0 - auVar155._0_4_ * fVar247) * fVar247 + fVar247;
      fVar251 = (1.0 - auVar155._4_4_ * fVar251) * fVar251 + fVar251;
      fVar252 = (1.0 - auVar155._8_4_ * fVar252) * fVar252 + fVar252;
      fVar255 = (1.0 - auVar155._12_4_ * fVar255) * fVar255 + fVar255;
      fVar105 = (-fVar179 - auVar241._0_4_) * fVar247;
      fVar121 = (-fVar135 - auVar241._4_4_) * fVar251;
      fVar123 = (-fVar180 - auVar241._8_4_) * fVar252;
      fVar133 = (-fVar192 - auVar241._12_4_) * fVar255;
      fVar247 = (auVar241._0_4_ - fVar179) * fVar247;
      fVar251 = (auVar241._4_4_ - fVar135) * fVar251;
      fVar252 = (auVar241._8_4_ - fVar180) * fVar252;
      fVar255 = (auVar241._12_4_ - fVar192) * fVar255;
      local_198 = (local_318 * fVar105 + local_1b8) * fVar124;
      fStack_194 = (fStack_314 * fVar121 + fStack_1b4) * fVar178;
      fStack_190 = (fStack_310 * fVar123 + fStack_1b0) * auVar249._8_4_;
      fStack_18c = (fStack_30c * fVar133 + fStack_1ac) * auVar249._12_4_;
      local_468._4_4_ = (fStack_314 * fVar251 + fStack_1b4) * fVar178;
      local_468._0_4_ = (local_318 * fVar247 + local_1b8) * fVar124;
      fStack_460 = (fStack_310 * fVar252 + fStack_1b0) * auVar249._8_4_;
      fStack_45c = (fStack_30c * fVar255 + fStack_1ac) * auVar249._12_4_;
      auVar156._0_4_ = (uint)fVar105 & uVar53;
      auVar156._4_4_ = (uint)fVar121 & uVar54;
      auVar156._8_4_ = (uint)fVar123 & uVar55;
      auVar156._12_4_ = (uint)fVar133 & uVar58;
      auVar213._0_8_ = CONCAT44(~uVar54,~uVar53) & 0x7f8000007f800000;
      auVar213._8_4_ = ~uVar55 & 0x7f800000;
      auVar213._12_4_ = ~uVar58 & 0x7f800000;
      auVar213 = auVar213 | auVar156;
      auVar250._0_4_ = (uint)fVar247 & uVar53;
      auVar250._4_4_ = (uint)fVar251 & uVar54;
      auVar250._8_4_ = (uint)fVar252 & uVar55;
      auVar250._12_4_ = (uint)fVar255 & uVar58;
      auVar189._0_8_ = CONCAT44(~uVar54,~uVar53) & 0xff800000ff800000;
      auVar189._8_4_ = ~uVar55 & 0xff800000;
      auVar189._12_4_ = ~uVar58 & 0xff800000;
      auVar189 = auVar189 | auVar250;
      auVar234._0_8_ = CONCAT44(fStack_164,local_168) & 0x7fffffff7fffffff;
      auVar234._8_4_ = ABS(fStack_160);
      auVar234._12_4_ = ABS(fStack_15c);
      auVar20._4_4_ = fStack_2b4;
      auVar20._0_4_ = local_2b8;
      auVar20._8_4_ = fStack_2b0;
      auVar20._12_4_ = fStack_2ac;
      auVar67 = maxps(auVar20,auVar234);
      fVar105 = auVar67._0_4_ * 1.9073486e-06;
      fVar121 = auVar67._4_4_ * 1.9073486e-06;
      fVar123 = auVar67._8_4_ * 1.9073486e-06;
      fVar133 = auVar67._12_4_ * 1.9073486e-06;
      auVar263._0_4_ = -(uint)(ABS(local_2c8) < fVar105 && bVar51);
      auVar263._4_4_ = -(uint)(ABS(fStack_2c4) < fVar121 && bVar9);
      auVar263._8_4_ = -(uint)(ABS(fStack_2c0) < fVar123 && bVar10);
      auVar263._12_4_ = -(uint)(ABS(fStack_2bc) < fVar133 && bVar11);
      iVar39 = movmskps(iVar39,auVar263);
      if (iVar39 != 0) {
        uVar53 = -(uint)(auVar188._0_4_ <= 0.0);
        uVar54 = -(uint)(auVar188._4_4_ <= 0.0);
        uVar55 = -(uint)(auVar188._8_4_ <= 0.0);
        uVar58 = -(uint)(auVar188._12_4_ <= 0.0);
        auVar157._0_4_ = (uVar53 & 0xff800000 | ~uVar53 & 0x7f800000) & auVar263._0_4_;
        auVar157._4_4_ = (uVar54 & 0xff800000 | ~uVar54 & 0x7f800000) & auVar263._4_4_;
        auVar157._8_4_ = (uVar55 & 0xff800000 | ~uVar55 & 0x7f800000) & auVar263._8_4_;
        auVar157._12_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar263._12_4_;
        auVar79._0_4_ = ~auVar263._0_4_ & auVar213._0_4_;
        auVar79._4_4_ = ~auVar263._4_4_ & auVar213._4_4_;
        auVar79._8_4_ = ~auVar263._8_4_ & auVar213._8_4_;
        auVar79._12_4_ = ~auVar263._12_4_ & auVar213._12_4_;
        auVar158._0_4_ = (uVar53 & 0x7f800000 | ~uVar53 & 0xff800000) & auVar263._0_4_;
        auVar158._4_4_ = (uVar54 & 0x7f800000 | ~uVar54 & 0xff800000) & auVar263._4_4_;
        auVar158._8_4_ = (uVar55 & 0x7f800000 | ~uVar55 & 0xff800000) & auVar263._8_4_;
        auVar158._12_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar263._12_4_;
        auVar264._0_4_ = ~auVar263._0_4_ & auVar189._0_4_;
        auVar264._4_4_ = ~auVar263._4_4_ & auVar189._4_4_;
        auVar264._8_4_ = ~auVar263._8_4_ & auVar189._8_4_;
        auVar264._12_4_ = ~auVar263._12_4_ & auVar189._12_4_;
        auVar126._4_4_ = -(uint)((fVar121 <= ABS(fStack_2c4) || auVar188._4_4_ <= 0.0) && bVar9);
        auVar126._0_4_ = -(uint)((fVar105 <= ABS(local_2c8) || auVar188._0_4_ <= 0.0) && bVar51);
        auVar126._8_4_ = -(uint)((fVar123 <= ABS(fStack_2c0) || auVar188._8_4_ <= 0.0) && bVar10);
        auVar126._12_4_ = -(uint)((fVar133 <= ABS(fStack_2bc) || auVar188._12_4_ <= 0.0) && bVar11);
        auVar189 = auVar264 | auVar158;
        auVar213 = auVar79 | auVar157;
      }
    }
    auVar127._0_4_ = (auVar126._0_4_ << 0x1f) >> 0x1f;
    auVar127._4_4_ = (auVar126._4_4_ << 0x1f) >> 0x1f;
    auVar127._8_4_ = (auVar126._8_4_ << 0x1f) >> 0x1f;
    auVar127._12_4_ = (auVar126._12_4_ << 0x1f) >> 0x1f;
    auVar127 = auVar127 & local_188;
    iVar39 = movmskps(iVar39,auVar127);
    if (iVar39 == 0) {
LAB_00a7aefb:
      pauVar45 = (undefined1 (*) [16])CONCAT44(uVar46,iVar39);
    }
    else {
      auVar275._0_4_ = (ray->org).field_0.m128[3] - (float)local_2e8._0_4_;
      auVar275._4_4_ = auVar275._0_4_;
      auVar275._8_4_ = auVar275._0_4_;
      auVar275._12_4_ = auVar275._0_4_;
      auVar241 = maxps(auVar275,auVar213);
      auVar276._0_4_ = ray->tfar - (float)local_2e8._0_4_;
      auVar276._4_4_ = auVar276._0_4_;
      auVar276._8_4_ = auVar276._0_4_;
      auVar276._12_4_ = auVar276._0_4_;
      auVar233 = minps(auVar276,auVar189);
      auVar80._0_4_ = fVar225 * local_438 + local_3a8 * local_4b8;
      auVar80._4_4_ = fVar239 * fStack_434 + fStack_3a4 * fStack_4b4;
      auVar80._8_4_ = fStack_390 * fStack_430 + fStack_3a0 * fStack_4b0;
      auVar80._12_4_ = fStack_38c * fStack_42c + fStack_39c * fStack_4ac;
      auVar214._0_4_ = local_3f8 * local_368 + auVar80._0_4_;
      auVar214._4_4_ = fStack_3f4 * fStack_364 + auVar80._4_4_;
      auVar214._8_4_ = fStack_3f0 * fStack_360 + auVar80._8_4_;
      auVar214._12_4_ = fStack_3ec * fStack_35c + auVar80._12_4_;
      auVar67 = rcpps(auVar80,auVar214);
      fVar105 = auVar67._0_4_;
      fVar121 = auVar67._4_4_;
      fVar123 = auVar67._8_4_;
      fVar133 = auVar67._12_4_;
      fVar105 = ((1.0 - auVar214._0_4_ * fVar105) * fVar105 + fVar105) *
                -(fVar193 * local_3f8 + fVar150 * fVar225 + local_3e8 * local_3a8);
      fVar121 = ((1.0 - auVar214._4_4_ * fVar121) * fVar121 + fVar121) *
                -(fVar194 * fStack_3f4 + fVar167 * fVar239 + fStack_3e4 * fStack_3a4);
      fVar123 = ((1.0 - auVar214._8_4_ * fVar123) * fVar123 + fVar123) *
                -(fVar237 * fStack_3f0 + fVar168 * fStack_390 + fStack_3e0 * fStack_3a0);
      fVar133 = ((1.0 - auVar214._12_4_ * fVar133) * fVar133 + fVar133) *
                -(fVar246 * fStack_3ec + fVar169 * fStack_38c + fStack_3dc * fStack_39c);
      uVar53 = -(uint)(auVar214._0_4_ < 0.0 || ABS(auVar214._0_4_) < 1e-18);
      uVar54 = -(uint)(auVar214._4_4_ < 0.0 || ABS(auVar214._4_4_) < 1e-18);
      uVar55 = -(uint)(auVar214._8_4_ < 0.0 || ABS(auVar214._8_4_) < 1e-18);
      uVar58 = -(uint)(auVar214._12_4_ < 0.0 || ABS(auVar214._12_4_) < 1e-18);
      auVar159._0_8_ = CONCAT44(uVar54,uVar53) & 0xff800000ff800000;
      auVar159._8_4_ = uVar55 & 0xff800000;
      auVar159._12_4_ = uVar58 & 0xff800000;
      auVar81._0_4_ = ~uVar53 & (uint)fVar105;
      auVar81._4_4_ = ~uVar54 & (uint)fVar121;
      auVar81._8_4_ = ~uVar55 & (uint)fVar123;
      auVar81._12_4_ = ~uVar58 & (uint)fVar133;
      auVar241 = maxps(auVar241,auVar81 | auVar159);
      uVar53 = -(uint)(0.0 < auVar214._0_4_ || ABS(auVar214._0_4_) < 1e-18);
      uVar54 = -(uint)(0.0 < auVar214._4_4_ || ABS(auVar214._4_4_) < 1e-18);
      uVar55 = -(uint)(0.0 < auVar214._8_4_ || ABS(auVar214._8_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar214._12_4_ || ABS(auVar214._12_4_) < 1e-18);
      auVar82._0_8_ = CONCAT44(uVar54,uVar53) & 0x7f8000007f800000;
      auVar82._8_4_ = uVar55 & 0x7f800000;
      auVar82._12_4_ = uVar58 & 0x7f800000;
      auVar215._0_4_ = ~uVar53 & (uint)fVar105;
      auVar215._4_4_ = ~uVar54 & (uint)fVar121;
      auVar215._8_4_ = ~uVar55 & (uint)fVar123;
      auVar215._12_4_ = ~uVar58 & (uint)fVar133;
      auVar233 = minps(auVar233,auVar215 | auVar82);
      auVar111._0_4_ = (0.0 - fVar226) * -fVar239 + (0.0 - fVar260) * -fStack_3a4;
      auVar111._4_4_ = (0.0 - fVar238) * -fStack_390 + (0.0 - fVar265) * -fStack_3a0;
      auVar111._8_4_ = (0.0 - fVar248) * -fStack_38c + (0.0 - fVar266) * -fStack_39c;
      auVar111._12_4_ = 0x80000000;
      auVar216._0_4_ = -fStack_3f4 * local_368 + -fVar239 * local_438 + -fStack_3a4 * local_4b8;
      auVar216._4_4_ =
           -fStack_3f0 * fStack_364 + -fStack_390 * fStack_434 + -fStack_3a0 * fStack_4b4;
      auVar216._8_4_ =
           -fStack_3ec * fStack_360 + -fStack_38c * fStack_430 + -fStack_39c * fStack_4b0;
      auVar216._12_4_ = fStack_35c * -0.0 + fStack_42c * -0.0 + fStack_4ac * -0.0;
      auVar67 = rcpps(auVar111,auVar216);
      fVar105 = auVar67._0_4_;
      fVar121 = auVar67._4_4_;
      fVar123 = auVar67._8_4_;
      fVar133 = auVar67._12_4_;
      fVar105 = (((float)DAT_01f7ba10 - auVar216._0_4_ * fVar105) * fVar105 + fVar105) *
                -((0.0 - fVar268) * -fStack_3f4 + auVar111._0_4_);
      fVar121 = ((DAT_01f7ba10._4_4_ - auVar216._4_4_ * fVar121) * fVar121 + fVar121) *
                -((0.0 - fVar273) * -fStack_3f0 + auVar111._4_4_);
      fVar123 = ((DAT_01f7ba10._8_4_ - auVar216._8_4_ * fVar123) * fVar123 + fVar123) *
                -((0.0 - fVar274) * -fStack_3ec + auVar111._8_4_);
      fVar133 = ((DAT_01f7ba10._12_4_ - auVar216._12_4_ * fVar133) * fVar133 + fVar133) * 0.0;
      uVar53 = -(uint)(auVar216._0_4_ < 0.0 || ABS(auVar216._0_4_) < 1e-18);
      uVar54 = -(uint)(auVar216._4_4_ < 0.0 || ABS(auVar216._4_4_) < 1e-18);
      uVar55 = -(uint)(auVar216._8_4_ < 0.0 || ABS(auVar216._8_4_) < 1e-18);
      uVar58 = -(uint)(auVar216._12_4_ < 0.0 || ABS(auVar216._12_4_) < 1e-18);
      auVar112._0_8_ = CONCAT44(uVar54,uVar53) & 0xff800000ff800000;
      auVar112._8_4_ = uVar55 & 0xff800000;
      auVar112._12_4_ = uVar58 & 0xff800000;
      auVar83._0_4_ = ~uVar53 & (uint)fVar105;
      auVar83._4_4_ = ~uVar54 & (uint)fVar121;
      auVar83._8_4_ = ~uVar55 & (uint)fVar123;
      auVar83._12_4_ = ~uVar58 & (uint)fVar133;
      auVar67 = maxps(auVar241,auVar83 | auVar112);
      uVar53 = -(uint)(0.0 < auVar216._0_4_ || ABS(auVar216._0_4_) < 1e-18);
      uVar54 = -(uint)(0.0 < auVar216._4_4_ || ABS(auVar216._4_4_) < 1e-18);
      uVar55 = -(uint)(0.0 < auVar216._8_4_ || ABS(auVar216._8_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar216._12_4_ || ABS(auVar216._12_4_) < 1e-18);
      auVar235._0_8_ = CONCAT44(uVar54,uVar53) & 0x7f8000007f800000;
      auVar235._8_4_ = uVar55 & 0x7f800000;
      auVar235._12_4_ = uVar58 & 0x7f800000;
      auVar217._0_4_ = ~uVar53 & (uint)fVar105;
      auVar217._4_4_ = ~uVar54 & (uint)fVar121;
      auVar217._8_4_ = ~uVar55 & (uint)fVar123;
      auVar217._12_4_ = ~uVar58 & (uint)fVar133;
      local_1d8 = minps(auVar233,auVar217 | auVar235);
      fVar133 = auVar67._12_4_;
      fVar105 = auVar67._0_4_;
      fVar121 = auVar67._4_4_;
      fVar123 = auVar67._8_4_;
      auVar84._0_4_ = -(uint)(fVar105 <= local_1d8._0_4_) & auVar127._0_4_;
      auVar84._4_4_ = -(uint)(fVar121 <= local_1d8._4_4_) & auVar127._4_4_;
      auVar84._8_4_ = -(uint)(fVar123 <= local_1d8._8_4_) & auVar127._8_4_;
      auVar84._12_4_ = -(uint)(fVar133 <= local_1d8._12_4_) & auVar127._12_4_;
      iVar39 = movmskps(iVar39,auVar84);
      if (iVar39 == 0) goto LAB_00a7aefb;
      auVar241 = maxps(ZEXT816(0),_local_448);
      auVar22._4_4_ = fStack_194;
      auVar22._0_4_ = local_198;
      auVar22._8_4_ = fStack_190;
      auVar22._12_4_ = fStack_18c;
      auVar233 = minps(auVar22,_DAT_01f7ba10);
      auVar160._0_12_ = ZEXT812(0);
      auVar160._12_4_ = 0.0;
      auVar187 = maxps(auVar233,auVar160);
      auVar233 = minps(_local_468,_DAT_01f7ba10);
      auVar233 = maxps(auVar233,auVar160);
      local_108[0] = (auVar187._0_4_ + 0.0) * 0.25 * (float)local_408._4_4_ + local_178;
      local_108[1] = (auVar187._4_4_ + 1.0) * 0.25 * (float)local_408._4_4_ + local_178;
      local_108[2] = (auVar187._8_4_ + 2.0) * 0.25 * (float)local_408._4_4_ + local_178;
      local_108[3] = (auVar187._12_4_ + 3.0) * 0.25 * (float)local_408._4_4_ + local_178;
      local_118[0] = (auVar233._0_4_ + 0.0) * 0.25 * (float)local_408._4_4_ + local_178;
      local_118[1] = (auVar233._4_4_ + 1.0) * 0.25 * (float)local_408._4_4_ + local_178;
      local_118[2] = (auVar233._8_4_ + 2.0) * 0.25 * (float)local_408._4_4_ + local_178;
      local_118[3] = (auVar233._12_4_ + 3.0) * 0.25 * (float)local_408._4_4_ + local_178;
      auVar128._0_4_ = fVar134 - auVar241._0_4_ * auVar241._0_4_;
      auVar128._4_4_ = fVar136 - auVar241._4_4_ * auVar241._4_4_;
      auVar128._8_4_ = fVar148 - auVar241._8_4_ * auVar241._8_4_;
      auVar128._12_4_ = fVar149 - auVar241._12_4_ * auVar241._12_4_;
      auVar243._0_4_ = fVar179 * fVar179 - local_428 * auVar128._0_4_;
      auVar243._4_4_ = fVar135 * fVar135 - fStack_424 * auVar128._4_4_;
      auVar243._8_4_ = fVar180 * fVar180 - fStack_420 * auVar128._8_4_;
      auVar243._12_4_ = fVar192 * fVar192 - fStack_41c * auVar128._12_4_;
      local_468._4_4_ = -(uint)(0.0 <= auVar243._4_4_);
      local_468._0_4_ = -(uint)(0.0 <= auVar243._0_4_);
      fStack_460 = (float)-(uint)(0.0 <= auVar243._8_4_);
      fStack_45c = (float)-(uint)(0.0 <= auVar243._12_4_);
      iVar39 = movmskps(iVar39,_local_468);
      if (iVar39 == 0) {
        fVar179 = 0.0;
        fVar135 = 0.0;
        fVar180 = 0.0;
        fVar192 = 0.0;
        fVar150 = 0.0;
        fVar167 = 0.0;
        fVar168 = 0.0;
        fVar169 = 0.0;
        fVar193 = 0.0;
        fVar194 = 0.0;
        fVar225 = 0.0;
        fVar237 = 0.0;
        fVar134 = 0.0;
        fVar136 = 0.0;
        fVar148 = 0.0;
        fVar149 = 0.0;
        _local_4c8 = ZEXT816(0);
        iVar39 = 0;
        auVar191 = _DAT_01f7aa00;
        auVar218 = _DAT_01f7a9f0;
      }
      else {
        auVar233 = sqrtps(_local_408,auVar243);
        auVar113._0_4_ = local_2c8 + local_2c8;
        auVar113._4_4_ = fStack_2c4 + fStack_2c4;
        auVar113._8_4_ = fStack_2c0 + fStack_2c0;
        auVar113._12_4_ = fStack_2bc + fStack_2bc;
        auVar241 = rcpps(auVar128,auVar113);
        fVar239 = auVar241._0_4_;
        fVar246 = auVar241._4_4_;
        fVar247 = auVar241._8_4_;
        fVar251 = auVar241._12_4_;
        fVar239 = ((float)DAT_01f7ba10 - auVar113._0_4_ * fVar239) * fVar239 + fVar239;
        fVar246 = (DAT_01f7ba10._4_4_ - auVar113._4_4_ * fVar246) * fVar246 + fVar246;
        fVar247 = (DAT_01f7ba10._8_4_ - auVar113._8_4_ * fVar247) * fVar247 + fVar247;
        fVar251 = (DAT_01f7ba10._12_4_ - auVar113._12_4_ * fVar251) * fVar251 + fVar251;
        fVar252 = (-fVar179 - auVar233._0_4_) * fVar239;
        fVar255 = (-fVar135 - auVar233._4_4_) * fVar246;
        fVar257 = (-fVar180 - auVar233._8_4_) * fVar247;
        fVar258 = (-fVar192 - auVar233._12_4_) * fVar251;
        fVar239 = (auVar233._0_4_ - fVar179) * fVar239;
        fVar246 = (auVar233._4_4_ - fVar135) * fVar246;
        fVar247 = (auVar233._8_4_ - fVar180) * fVar247;
        fVar251 = (auVar233._12_4_ - fVar192) * fVar251;
        fVar150 = (local_318 * fVar252 + local_1b8) * fVar124;
        fVar167 = (fStack_314 * fVar255 + fStack_1b4) * fVar178;
        fVar168 = (fStack_310 * fVar257 + fStack_1b0) * auVar249._8_4_;
        fVar169 = (fStack_30c * fVar258 + fStack_1ac) * auVar249._12_4_;
        fVar193 = local_368 * fVar252 - ((float)local_308._0_4_ * fVar150 + fVar267);
        fVar194 = fStack_364 * fVar255 - ((float)local_308._4_4_ * fVar167 + fVar268);
        fVar225 = fStack_360 * fVar257 - (fStack_300 * fVar168 + fVar273);
        fVar237 = fStack_35c * fVar258 - (fStack_2fc * fVar169 + fVar274);
        fVar134 = local_438 * fVar252 - ((float)local_458._0_4_ * fVar150 + fVar224);
        fVar136 = fStack_434 * fVar255 - ((float)local_458._4_4_ * fVar167 + fVar226);
        fVar148 = fStack_430 * fVar257 - (fStack_450 * fVar168 + fVar238);
        fVar149 = fStack_42c * fVar258 - (fStack_44c * fVar169 + fVar248);
        local_4c8._4_4_ = fStack_4b4 * fVar255 - (fVar167 * (float)local_2f8._4_4_ + fVar260);
        local_4c8._0_4_ = local_4b8 * fVar252 - (fVar150 * (float)local_2f8._0_4_ + fVar259);
        fStack_4c0 = fStack_4b0 * fVar257 - (fVar168 * fStack_2f0 + fVar265);
        fStack_4bc = fStack_4ac * fVar258 - (fVar169 * fStack_2ec + fVar266);
        fVar124 = (local_318 * fVar239 + local_1b8) * fVar124;
        fVar178 = (fStack_314 * fVar246 + fStack_1b4) * fVar178;
        fVar253 = (fStack_310 * fVar247 + fStack_1b0) * auVar249._8_4_;
        fVar254 = (fStack_30c * fVar251 + fStack_1ac) * auVar249._12_4_;
        fVar179 = local_368 * fVar239 - ((float)local_308._0_4_ * fVar124 + fVar267);
        fVar135 = fStack_364 * fVar246 - ((float)local_308._4_4_ * fVar178 + fVar268);
        fVar180 = fStack_360 * fVar247 - (fStack_300 * fVar253 + fVar273);
        fVar192 = fStack_35c * fVar251 - (fStack_2fc * fVar254 + fVar274);
        fVar150 = local_438 * fVar239 - ((float)local_458._0_4_ * fVar124 + fVar224);
        fVar167 = fStack_434 * fVar246 - ((float)local_458._4_4_ * fVar178 + fVar226);
        fVar168 = fStack_430 * fVar247 - (fStack_450 * fVar253 + fVar238);
        fVar169 = fStack_42c * fVar251 - (fStack_44c * fVar254 + fVar248);
        bVar51 = 0.0 <= auVar243._0_4_;
        uVar53 = -(uint)bVar51;
        bVar9 = 0.0 <= auVar243._4_4_;
        uVar54 = -(uint)bVar9;
        bVar10 = 0.0 <= auVar243._8_4_;
        uVar55 = -(uint)bVar10;
        bVar11 = 0.0 <= auVar243._12_4_;
        uVar58 = -(uint)bVar11;
        auVar160._0_4_ = local_4b8 * fVar239 - (fVar124 * (float)local_2f8._0_4_ + fVar259);
        auVar160._4_4_ = fStack_4b4 * fVar246 - (fVar178 * (float)local_2f8._4_4_ + fVar260);
        auVar160._8_4_ = fStack_4b0 * fVar247 - (fVar253 * fStack_2f0 + fVar265);
        auVar160._12_4_ = fStack_4ac * fVar251 - (fVar254 * fStack_2ec + fVar266);
        auVar190._0_4_ = (uint)fVar252 & uVar53;
        auVar190._4_4_ = (uint)fVar255 & uVar54;
        auVar190._8_4_ = (uint)fVar257 & uVar55;
        auVar190._12_4_ = (uint)fVar258 & uVar58;
        auVar218._0_8_ = CONCAT44(~uVar54,~uVar53) & 0x7f8000007f800000;
        auVar218._8_4_ = ~uVar55 & 0x7f800000;
        auVar218._12_4_ = ~uVar58 & 0x7f800000;
        auVar218 = auVar218 | auVar190;
        auVar175._0_4_ = (uint)fVar239 & uVar53;
        auVar175._4_4_ = (uint)fVar246 & uVar54;
        auVar175._8_4_ = (uint)fVar247 & uVar55;
        auVar175._12_4_ = (uint)fVar251 & uVar58;
        auVar191._0_8_ = CONCAT44(~uVar54,~uVar53) & 0xff800000ff800000;
        auVar191._8_4_ = ~uVar55 & 0xff800000;
        auVar191._12_4_ = ~uVar58 & 0xff800000;
        auVar191 = auVar191 | auVar175;
        auVar114._0_8_ = CONCAT44(fStack_164,local_168) & 0x7fffffff7fffffff;
        auVar114._8_4_ = ABS(fStack_160);
        auVar114._12_4_ = ABS(fStack_15c);
        auVar21._4_4_ = fStack_2b4;
        auVar21._0_4_ = local_2b8;
        auVar21._8_4_ = fStack_2b0;
        auVar21._12_4_ = fStack_2ac;
        auVar241 = maxps(auVar21,auVar114);
        fVar124 = auVar241._0_4_ * 1.9073486e-06;
        fVar178 = auVar241._4_4_ * 1.9073486e-06;
        fVar224 = auVar241._8_4_ * 1.9073486e-06;
        fVar226 = auVar241._12_4_ * 1.9073486e-06;
        auVar176._0_4_ = -(uint)(ABS(local_2c8) < fVar124 && bVar51);
        auVar176._4_4_ = -(uint)(ABS(fStack_2c4) < fVar178 && bVar9);
        auVar176._8_4_ = -(uint)(ABS(fStack_2c0) < fVar224 && bVar10);
        auVar176._12_4_ = -(uint)(ABS(fStack_2bc) < fVar226 && bVar11);
        iVar39 = movmskps(iVar39,auVar176);
        if (iVar39 != 0) {
          uVar53 = -(uint)(auVar128._0_4_ <= 0.0);
          uVar54 = -(uint)(auVar128._4_4_ <= 0.0);
          uVar55 = -(uint)(auVar128._8_4_ <= 0.0);
          uVar58 = -(uint)(auVar128._12_4_ <= 0.0);
          auVar244._0_4_ = (uVar53 & 0xff800000 | ~uVar53 & 0x7f800000) & auVar176._0_4_;
          auVar244._4_4_ = (uVar54 & 0xff800000 | ~uVar54 & 0x7f800000) & auVar176._4_4_;
          auVar244._8_4_ = (uVar55 & 0xff800000 | ~uVar55 & 0x7f800000) & auVar176._8_4_;
          auVar244._12_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar176._12_4_;
          auVar236._0_4_ = ~auVar176._0_4_ & auVar218._0_4_;
          auVar236._4_4_ = ~auVar176._4_4_ & auVar218._4_4_;
          auVar236._8_4_ = ~auVar176._8_4_ & auVar218._8_4_;
          auVar236._12_4_ = ~auVar176._12_4_ & auVar218._12_4_;
          auVar218 = auVar236 | auVar244;
          auVar245._0_4_ = (uVar53 & 0x7f800000 | ~uVar53 & 0xff800000) & auVar176._0_4_;
          auVar245._4_4_ = (uVar54 & 0x7f800000 | ~uVar54 & 0xff800000) & auVar176._4_4_;
          auVar245._8_4_ = (uVar55 & 0x7f800000 | ~uVar55 & 0xff800000) & auVar176._8_4_;
          auVar245._12_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar176._12_4_;
          auVar177._0_4_ = ~auVar176._0_4_ & auVar191._0_4_;
          auVar177._4_4_ = ~auVar176._4_4_ & auVar191._4_4_;
          auVar177._8_4_ = ~auVar176._8_4_ & auVar191._8_4_;
          auVar177._12_4_ = ~auVar176._12_4_ & auVar191._12_4_;
          auVar191 = auVar177 | auVar245;
          local_468._4_4_ = -(uint)((fVar178 <= ABS(fStack_2c4) || auVar128._4_4_ <= 0.0) && bVar9);
          local_468._0_4_ = -(uint)((fVar124 <= ABS(local_2c8) || auVar128._0_4_ <= 0.0) && bVar51);
          fStack_460 = (float)-(uint)((fVar224 <= ABS(fStack_2c0) || auVar128._8_4_ <= 0.0) &&
                                     bVar10);
          fStack_45c = (float)-(uint)((fVar226 <= ABS(fStack_2bc) || auVar128._12_4_ <= 0.0) &&
                                     bVar11);
        }
      }
      fVar124 = (ray->dir).field_0.m128[0];
      fVar178 = (ray->dir).field_0.m128[1];
      fVar224 = (ray->dir).field_0.m128[2];
      local_448._4_4_ =
           -(uint)(0.3 <= ABS(fVar135 * fVar124 + fVar167 * fVar178 + auVar160._4_4_ * fVar224));
      local_448._0_4_ =
           -(uint)(0.3 <= ABS(fVar179 * fVar124 + fVar150 * fVar178 + auVar160._0_4_ * fVar224));
      fStack_440 = (float)-(uint)(0.3 <= ABS(fVar180 * fVar124 +
                                             fVar168 * fVar178 + auVar160._8_4_ * fVar224));
      fStack_43c = (float)-(uint)(0.3 <= ABS(fVar192 * fVar124 +
                                             fVar169 * fVar178 + auVar160._12_4_ * fVar224));
      _local_138 = auVar67;
      local_128 = minps(local_1d8,auVar218);
      _local_458 = maxps(auVar67,auVar191);
      local_1e8 = _local_458;
      local_308._0_4_ = -(uint)(fVar105 <= local_128._0_4_) & auVar84._0_4_;
      local_308._4_4_ = -(uint)(fVar121 <= local_128._4_4_) & auVar84._4_4_;
      fStack_300 = (float)(-(uint)(fVar123 <= local_128._8_4_) & auVar84._8_4_);
      fStack_2fc = (float)(-(uint)(fVar133 <= local_128._12_4_) & auVar84._12_4_);
      local_2f8 = (undefined1  [8])
                  CONCAT44(-(uint)(local_458._4_4_ <= local_1d8._4_4_) & auVar84._4_4_,
                           -(uint)(local_458._0_4_ <= local_1d8._0_4_) & auVar84._0_4_);
      fStack_2f0 = (float)(-(uint)(local_458._8_4_ <= local_1d8._8_4_) & auVar84._8_4_);
      fStack_2ec = (float)(-(uint)(local_458._12_4_ <= local_1d8._12_4_) & auVar84._12_4_);
      auVar85._8_4_ = fStack_2f0;
      auVar85._0_8_ = local_2f8;
      auVar85._12_4_ = fStack_2ec;
      iVar39 = movmskps(iVar39,auVar85 | _local_308);
      pauVar45 = (undefined1 (*) [16])CONCAT44(uVar46,iVar39);
      if (iVar39 != 0) {
        local_318 = (float)local_57c;
        fStack_314 = (float)local_57c;
        fStack_310 = (float)local_57c;
        fStack_30c = (float)local_57c;
        local_4c8._0_4_ =
             -(uint)(local_57c <
                    ((int)((-(uint)(0.3 <= ABS((float)local_4c8._0_4_ * fVar224 + fVar134 * fVar178
                                               + fVar193 * fVar124)) & local_468._0_4_) << 0x1f) >>
                    0x1f) + 4);
        local_4c8._4_4_ =
             -(uint)(local_57c <
                    ((int)((-(uint)(0.3 <= ABS((float)local_4c8._4_4_ * fVar224 + fVar136 * fVar178
                                               + fVar194 * fVar124)) & local_468._4_4_) << 0x1f) >>
                    0x1f) + 4);
        fStack_4c0 = (float)-(uint)(local_57c <
                                   ((int)((-(uint)(0.3 <= ABS(fStack_4c0 * fVar224 +
                                                              fVar148 * fVar178 + fVar225 * fVar124)
                                                  ) & (uint)fStack_460) << 0x1f) >> 0x1f) + 4);
        fStack_4bc = (float)-(uint)(local_57c <
                                   ((int)((-(uint)(0.3 <= ABS(fStack_4bc * fVar224 +
                                                              fVar149 * fVar178 + fVar237 * fVar124)
                                                  ) & (uint)fStack_45c) << 0x1f) >> 0x1f) + 4);
        local_2d8 = ~_local_4c8 & _local_308;
        iVar39 = movmskps(iVar39,local_2d8);
        if (iVar39 == 0) {
          fVar105 = ray->tfar;
        }
        else {
          local_428 = fVar100 + fVar105;
          fStack_424 = fVar100 + fVar121;
          fStack_420 = fVar100 + fVar123;
          fStack_41c = fVar100 + fVar133;
          do {
            auVar233 = ~local_2d8 & _DAT_01f7a9f0 | local_2d8 & auVar67;
            auVar140._4_4_ = auVar233._0_4_;
            auVar140._0_4_ = auVar233._4_4_;
            auVar140._8_4_ = auVar233._12_4_;
            auVar140._12_4_ = auVar233._8_4_;
            auVar241 = minps(auVar140,auVar233);
            auVar86._0_8_ = auVar241._8_8_;
            auVar86._8_4_ = auVar241._0_4_;
            auVar86._12_4_ = auVar241._4_4_;
            auVar241 = minps(auVar86,auVar241);
            auVar87._0_8_ =
                 CONCAT44(-(uint)(auVar241._4_4_ == auVar233._4_4_) & local_2d8._4_4_,
                          -(uint)(auVar241._0_4_ == auVar233._0_4_) & local_2d8._0_4_);
            auVar87._8_4_ = -(uint)(auVar241._8_4_ == auVar233._8_4_) & local_2d8._8_4_;
            auVar87._12_4_ = -(uint)(auVar241._12_4_ == auVar233._12_4_) & local_2d8._12_4_;
            iVar39 = movmskps(iVar39,auVar87);
            auVar115 = local_2d8;
            if (iVar39 != 0) {
              auVar115._8_4_ = auVar87._8_4_;
              auVar115._0_8_ = auVar87._0_8_;
              auVar115._12_4_ = auVar87._12_4_;
            }
            uVar40 = movmskps(iVar39,auVar115);
            lVar42 = 0;
            if (CONCAT44(uVar46,uVar40) != 0) {
              for (; (CONCAT44(uVar46,uVar40) >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
              }
            }
            *(undefined4 *)(local_2d8 + lVar42 * 4) = 0;
            fVar105 = (ray->dir).field_0.m128[0];
            fVar121 = (ray->dir).field_0.m128[1];
            fVar123 = (ray->dir).field_0.m128[2];
            fVar133 = (ray->dir).field_0.m128[3];
            auVar18._4_4_ = fStack_324;
            auVar18._0_4_ = local_328;
            auVar18._8_4_ = fStack_320;
            auVar18._12_4_ = fStack_31c;
            auVar16._4_4_ = fStack_334;
            auVar16._0_4_ = local_338;
            auVar16._8_4_ = fStack_330;
            auVar16._12_4_ = fStack_32c;
            auVar233 = minps(auVar18,auVar16);
            auVar187 = maxps(auVar18,auVar16);
            auVar14._4_4_ = fStack_344;
            auVar14._0_4_ = local_348;
            auVar14._8_4_ = fStack_340;
            auVar14._12_4_ = fStack_33c;
            auVar12._4_4_ = fStack_354;
            auVar12._0_4_ = local_358;
            auVar12._8_4_ = fStack_350;
            auVar12._12_4_ = fStack_34c;
            auVar241 = minps(auVar14,auVar12);
            auVar233 = minps(auVar233,auVar241);
            auVar241 = maxps(auVar14,auVar12);
            auVar241 = maxps(auVar187,auVar241);
            auVar161._0_8_ = auVar233._0_8_ & 0x7fffffff7fffffff;
            auVar161._8_4_ = auVar233._8_4_ & 0x7fffffff;
            auVar161._12_4_ = auVar233._12_4_ & 0x7fffffff;
            local_418 = auVar241._12_4_;
            auVar88._0_8_ = auVar241._0_8_ & 0x7fffffff7fffffff;
            auVar88._8_4_ = auVar241._8_4_ & 0x7fffffff;
            auVar88._12_4_ = ABS(local_418);
            auVar241 = maxps(auVar161,auVar88);
            fVar134 = auVar241._4_4_;
            if (auVar241._4_4_ <= auVar241._0_4_) {
              fVar134 = auVar241._0_4_;
            }
            auVar162._8_8_ = auVar241._8_8_;
            auVar162._0_8_ = auVar241._8_8_;
            if (auVar241._8_4_ <= fVar134) {
              auVar162._0_4_ = fVar134;
            }
            fVar148 = auVar162._0_4_ * 1.9073486e-06;
            fStack_414 = local_418;
            fStack_410 = local_418;
            fStack_40c = local_418;
            fVar134 = local_108[lVar42];
            fVar136 = *(float *)(local_138 + lVar42 * 4);
            fVar149 = 0.0;
            fVar150 = 0.0;
            bVar51 = true;
            uVar41 = 0;
            do {
              fVar135 = SQRT(fVar123 * fVar123 + fVar121 * fVar121 + fVar105 * fVar105) *
                        1.9073486e-06 * fVar136;
              fVar168 = 1.0 - fVar134;
              fVar192 = fVar134 * 3.0;
              fVar167 = -fVar134 * fVar168 * fVar168 * 0.5;
              fVar237 = (fVar134 * fVar134 * (fVar192 + -5.0) + 2.0) * 0.5;
              fVar226 = ((fVar168 * 3.0 + -5.0) * fVar168 * fVar168 + 2.0) * 0.5;
              fVar238 = -fVar168 * fVar134 * fVar134 * 0.5;
              fVar180 = fVar167 * fStack_31c +
                        fVar237 * fStack_32c + fVar226 * fStack_33c + fVar238 * fStack_34c;
              fVar194 = (fVar134 * (fVar168 + fVar168) - fVar168 * fVar168) * 0.5;
              fVar193 = ((fVar134 + fVar134) * (fVar192 + -5.0) + fVar134 * fVar192) * 0.5;
              fVar179 = ((fVar192 + 2.0) * (fVar168 + fVar168) + fVar168 * -3.0 * fVar168) * 0.5;
              fVar168 = (fVar168 * -2.0 * fVar134 + fVar134 * fVar134) * 0.5;
              fVar169 = fVar194 * local_328 +
                        fVar193 * local_338 + fVar179 * local_348 + fVar168 * local_358;
              fVar124 = fVar194 * fStack_324 +
                        fVar193 * fStack_334 + fVar179 * fStack_344 + fVar168 * fStack_354;
              fVar178 = fVar194 * fStack_320 +
                        fVar193 * fStack_330 + fVar179 * fStack_340 + fVar168 * fStack_350;
              fVar179 = fVar194 * fStack_31c +
                        fVar193 * fStack_32c + fVar179 * fStack_33c + fVar168 * fStack_34c;
              fVar193 = fVar134 * -3.0 + 2.0;
              fVar225 = fVar134 * 9.0 + -5.0;
              fVar168 = fVar134 * -9.0 + 4.0;
              fVar192 = fVar192 + -1.0;
              fVar194 = fVar193 * local_328 +
                        fVar225 * local_338 + fVar168 * local_348 + fVar192 * local_358;
              fVar224 = fVar193 * fStack_324 +
                        fVar225 * fStack_334 + fVar168 * fStack_344 + fVar192 * fStack_354;
              fVar192 = fVar193 * fStack_320 +
                        fVar225 * fStack_330 + fVar168 * fStack_340 + fVar192 * fStack_350;
              fVar193 = (fVar136 * fVar105 + 0.0) -
                        (fVar167 * local_328 +
                        fVar237 * local_338 + fVar226 * local_348 + fVar238 * local_358);
              fVar225 = (fVar136 * fVar121 + 0.0) -
                        (fVar167 * fStack_324 +
                        fVar237 * fStack_334 + fVar226 * fStack_344 + fVar238 * fStack_354);
              fVar226 = (fVar136 * fVar123 + 0.0) -
                        (fVar167 * fStack_320 +
                        fVar237 * fStack_330 + fVar226 * fStack_340 + fVar238 * fStack_350);
              fVar168 = (fVar136 * fVar133 + 0.0) - fVar180;
              fVar167 = fVar225 * fVar225;
              fStack_390 = fVar226 * fVar226;
              fStack_38c = fVar168 * fVar168;
              local_398._0_4_ = fVar167 + fVar193 * fVar193 + fStack_390;
              local_398._4_4_ = fVar167 + fVar167 + fStack_38c;
              fStack_390 = fVar167 + fStack_390 + fStack_390;
              fStack_38c = fVar167 + fStack_38c + fStack_38c;
              fStack_534 = auVar162._4_4_;
              fStack_530 = auVar162._8_4_;
              fStack_52c = auVar162._12_4_;
              fVar167 = fVar148;
              if (fVar148 <= fVar135) {
                fVar167 = fVar135;
              }
              fVar239 = fVar124 * fVar124 + fVar169 * fVar169 + fVar178 * fVar178;
              auVar233 = ZEXT416((uint)fVar239);
              auVar241 = rsqrtss(ZEXT416((uint)fVar239),auVar233);
              fVar135 = auVar241._0_4_;
              fVar246 = fVar135 * 1.5 - fVar135 * fVar135 * fVar239 * 0.5 * fVar135;
              fVar257 = fVar169 * fVar246;
              fVar258 = fVar124 * fVar246;
              fVar259 = fVar178 * fVar246;
              local_5e8._4_4_ = fVar179 * fVar246;
              fVar251 = fVar192 * fVar178 + fVar224 * fVar124 + fVar194 * fVar169;
              auVar241 = rcpss(auVar233,auVar233);
              fVar238 = (2.0 - fVar239 * auVar241._0_4_) * auVar241._0_4_;
              fVar135 = fVar225 * fVar258;
              fVar247 = fVar226 * fVar259;
              fVar248 = fVar168 * (float)local_5e8._4_4_;
              fVar252 = fVar135 + fVar193 * fVar257 + fVar247;
              fVar255 = fVar135 + fVar135 + fVar248;
              fVar247 = fVar135 + fVar247 + fVar247;
              fVar248 = fVar135 + fVar248 + fVar248;
              fVar135 = (SQRT((float)local_398._0_4_) + 1.0) * (fVar148 / SQRT(fVar239)) +
                        SQRT((float)local_398._0_4_) * fVar148 + fVar167;
              fVar237 = fVar133 * (float)local_5e8._4_4_;
              local_5e8._4_4_ = (float)local_5e8._4_4_ * -fVar179;
              local_5e8._0_4_ =
                   fVar259 * -fVar178 + fVar258 * -fVar124 + fVar257 * -fVar169 +
                   fVar238 * (fVar239 * fVar192 - fVar251 * fVar178) * fVar246 * fVar226 +
                   fVar238 * (fVar239 * fVar224 - fVar251 * fVar124) * fVar246 * fVar225 +
                   fVar238 * (fVar239 * fVar194 - fVar251 * fVar169) * fVar246 * fVar193;
              fVar192 = fVar123 * fVar259 + fVar121 * fVar258 + fVar105 * fVar257;
              fVar239 = (float)local_398._0_4_ - fVar252 * fVar252;
              auVar89._0_8_ = CONCAT44((float)local_398._4_4_ - fVar255 * fVar255,fVar239);
              auVar89._8_4_ = fStack_390 - fVar247 * fVar247;
              auVar89._12_4_ = fStack_38c - fVar248 * fVar248;
              fVar247 = -fVar178 * fVar226;
              fVar238 = -fVar179 * fVar168;
              fVar224 = (fVar247 + -fVar124 * fVar225 + -fVar169 * fVar193) -
                        fVar252 * (float)local_5e8._0_4_;
              fVar168 = fVar133 * fVar168;
              fVar194 = (fVar123 * fVar226 + fVar121 * fVar225 + fVar105 * fVar193) -
                        fVar252 * fVar192;
              auVar116._8_4_ = auVar89._8_4_;
              auVar116._0_8_ = auVar89._0_8_;
              auVar116._12_4_ = auVar89._12_4_;
              auVar241 = rsqrtss(auVar116,auVar89);
              fVar246 = auVar241._0_4_;
              auVar141._0_4_ = fVar246 * 1.5 - fVar246 * fVar246 * fVar239 * 0.5 * fVar246;
              auVar141._4_12_ = auVar241._4_12_;
              local_4a8 = fVar136;
              fStack_4a4 = fVar134;
              fStack_4a0 = fVar149;
              fStack_49c = fVar150;
              if (fVar239 < 0.0) {
                fStack_3b4 = fStack_534;
                fStack_3b0 = fStack_530;
                fStack_3ac = fStack_52c;
                local_3c8._0_4_ = fVar135;
                _local_408 = auVar141;
                local_3f8 = fVar194;
                fStack_3f4 = fVar168;
                fStack_3f0 = fVar123 * fVar226;
                fStack_3ec = fVar168;
                local_3e8 = fVar192;
                fStack_3e4 = fVar237;
                fStack_3e0 = fVar123 * fVar259;
                fStack_3dc = fVar237;
                local_3d8 = fVar224;
                fStack_3d4 = fVar238;
                fStack_3d0 = fVar247;
                fStack_3cc = fVar238;
                local_3b8 = fVar167;
                local_3a8 = fVar169;
                fStack_3a4 = fVar124;
                fStack_3a0 = fVar178;
                fStack_39c = fVar179;
                fVar239 = sqrtf(fVar239);
                auVar141 = _local_408;
                fVar135 = (float)local_3c8._0_4_;
                fVar167 = local_3b8;
                fVar192 = local_3e8;
                fVar237 = fStack_3e4;
                fVar194 = local_3f8;
                fVar168 = fStack_3f4;
                fVar169 = local_3a8;
                fVar124 = fStack_3a4;
                fVar178 = fStack_3a0;
                fVar179 = fStack_39c;
                fVar224 = local_3d8;
                fVar238 = fStack_3d4;
              }
              else {
                fVar239 = SQRT(fVar239);
              }
              fVar239 = fVar239 - fVar180;
              fVar134 = fVar224 * auVar141._0_4_ - fVar179;
              fVar194 = fVar194 * auVar141._0_4_;
              auVar270._0_8_ = CONCAT44(fVar238,fVar134) ^ 0x8000000080000000;
              auVar142._0_4_ = (float)local_5e8._0_4_ * fVar194 - fVar192 * fVar134;
              auVar270._8_4_ = -fVar238;
              auVar270._12_4_ = fVar168;
              auVar269._8_8_ = auVar270._8_8_;
              auVar269._0_8_ = CONCAT44(fVar194,fVar134) ^ 0x80000000;
              auVar142._4_4_ = auVar142._0_4_;
              auVar142._8_4_ = auVar142._0_4_;
              auVar142._12_4_ = auVar142._0_4_;
              auVar233 = divps(auVar269,auVar142);
              auVar164._8_4_ = local_5e8._4_4_;
              auVar164._0_8_ = local_5e8;
              auVar164._12_4_ = -fVar237;
              auVar163._8_8_ = auVar164._8_8_;
              auVar163._0_8_ = CONCAT44(fVar192,local_5e8._0_4_) ^ 0x8000000000000000;
              auVar241 = divps(auVar163,auVar142);
              fVar136 = local_4a8 - (fVar239 * auVar241._0_4_ + fVar252 * auVar233._0_4_);
              fVar134 = fStack_4a4 - (fVar239 * auVar241._4_4_ + fVar252 * auVar233._4_4_);
              fVar149 = fStack_4a0 - (fVar239 * auVar241._8_4_ + fVar252 * auVar233._8_4_);
              fVar150 = fStack_49c - (fVar239 * auVar241._12_4_ + fVar252 * auVar233._12_4_);
              if ((ABS(fVar252) < fVar135) &&
                 (ABS(fVar239) < local_418 * 1.9073486e-06 + fVar167 + fVar135)) {
                fVar136 = local_2e8._0_4_ + fVar136;
                uVar44 = 0;
                if ((fVar136 < (ray->org).field_0.m128[3]) ||
                   (((fVar105 = ray->tfar, fVar105 < fVar136 || (uVar44 = 0, fVar134 < 0.0)) ||
                    (1.0 < fVar134)))) goto LAB_00a7b7ec;
                auVar241 = rsqrtss(_local_398,_local_398);
                fVar121 = auVar241._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar52].ptr;
                if ((pGVar7->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (uVar44 = CONCAT71((int7)((ulong)context->args >> 8),1),
                     pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00a7b7ec;
                  fVar121 = fVar121 * 1.5 + fVar121 * fVar121 * local_398._0_4_ * -0.5 * fVar121;
                  fVar193 = fVar193 * fVar121;
                  fVar225 = fVar225 * fVar121;
                  fVar226 = fVar226 * fVar121;
                  fVar121 = fVar179 * fVar193 + fVar169;
                  fVar123 = fVar179 * fVar225 + fVar124;
                  fVar133 = fVar179 * fVar226 + fVar178;
                  fVar148 = fVar225 * fVar169 - fVar124 * fVar193;
                  fVar149 = fVar226 * fVar124 - fVar178 * fVar225;
                  fVar150 = fVar193 * fVar178 - fVar169 * fVar226;
                  local_498 = CONCAT44(fVar121 * fVar148 - fVar149 * fVar133,
                                       fVar133 * fVar150 - fVar148 * fVar123);
                  fStack_490 = fVar123 * fVar149 - fVar150 * fVar121;
                  fStack_48c = fVar134;
                  local_488 = 0;
                  local_484 = (int)local_370;
                  local_480 = uVar52;
                  local_47c = context->user->instID[0];
                  local_478 = context->user->instPrimID[0];
                  ray->tfar = fVar136;
                  local_388._0_4_ = 0xffffffff;
                  local_4f8.geometryUserPtr = pGVar7->userPtr;
                  local_4f8.valid = (int *)local_388;
                  local_4f8.context = context->user;
                  local_4f8.hit = (RTCHitN *)&local_498;
                  local_4f8.N = 1;
                  local_4f8.ray = (RTCRayN *)ray;
                  if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a7ba5a:
                    p_Var43 = context->args->filter;
                    if ((p_Var43 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var43)(&local_4f8);
                      p_Var43 = (RTCFilterFunctionN)local_4f8.valid;
                      if (*local_4f8.valid == 0) goto LAB_00a7baba;
                    }
                    uVar44 = CONCAT71((int7)((ulong)p_Var43 >> 8),1);
                    goto LAB_00a7b7ec;
                  }
                  (*pGVar7->occlusionFilterN)(&local_4f8);
                  if (*local_4f8.valid != 0) goto LAB_00a7ba5a;
LAB_00a7baba:
                  ray->tfar = fVar105;
                }
                uVar44 = 0;
                goto LAB_00a7b7ec;
              }
              bVar51 = uVar41 < 4;
              uVar41 = uVar41 + 1;
            } while (uVar41 != 5);
            bVar51 = false;
            uVar44 = 5;
LAB_00a7b7ec:
            fVar105 = ray->tfar;
            local_2d8._0_4_ = -(uint)(local_428 <= fVar105) & local_2d8._0_4_;
            local_2d8._4_4_ = -(uint)(fStack_424 <= fVar105) & local_2d8._4_4_;
            local_2d8._8_4_ = -(uint)(fStack_420 <= fVar105) & local_2d8._8_4_;
            local_2d8._12_4_ = -(uint)(fStack_41c <= fVar105) & local_2d8._12_4_;
            bVar49 = (bool)(bVar49 | bVar51 & (byte)uVar44);
            uVar46 = (undefined4)((ulong)uVar44 >> 0x20);
            iVar39 = movmskps((int)uVar44,local_2d8);
            prim = local_378;
          } while (iVar39 != 0);
        }
        auVar129._0_4_ = -(uint)(local_458._0_4_ + fVar100 <= fVar105) & local_2f8._0_4_;
        auVar129._4_4_ = -(uint)(local_458._4_4_ + fVar100 <= fVar105) & local_2f8._4_4_;
        auVar129._8_4_ = -(uint)(local_458._8_4_ + fVar100 <= fVar105) & (uint)fStack_2f0;
        auVar129._12_4_ = -(uint)(local_458._12_4_ + fVar100 <= fVar105) & (uint)fStack_2ec;
        local_448._0_4_ =
             -(uint)((int)local_318 <
                    ((int)((local_448._0_4_ & local_468._0_4_) << 0x1f) >> 0x1f) + 4);
        local_448._4_4_ =
             -(uint)((int)fStack_314 <
                    ((int)((local_448._4_4_ & local_468._4_4_) << 0x1f) >> 0x1f) + 4);
        fStack_440 = (float)-(uint)((int)fStack_310 <
                                   ((int)(((uint)fStack_440 & (uint)fStack_460) << 0x1f) >> 0x1f) +
                                   4);
        fStack_43c = (float)-(uint)((int)fStack_30c <
                                   ((int)(((uint)fStack_43c & (uint)fStack_45c) << 0x1f) >> 0x1f) +
                                   4);
        _local_458 = auVar129;
        local_388 = ~_local_448 & auVar129;
        iVar39 = movmskps(0,local_388);
        if (iVar39 != 0) {
          fVar121 = local_1e8._0_4_;
          fVar123 = local_1e8._4_4_;
          fVar133 = local_1e8._8_4_;
          fVar134 = local_1e8._12_4_;
          local_428 = fVar100 + fVar121;
          fStack_424 = fVar100 + fVar123;
          fStack_420 = fVar100 + fVar133;
          fStack_41c = fVar100 + fVar134;
          do {
            uVar53 = local_388._0_4_;
            uVar54 = local_388._4_4_;
            uVar55 = local_388._8_4_;
            uVar58 = local_388._12_4_;
            auVar90._0_4_ = uVar53 & (uint)fVar121;
            auVar90._4_4_ = uVar54 & (uint)fVar123;
            auVar90._8_4_ = uVar55 & (uint)fVar133;
            auVar90._12_4_ = uVar58 & (uint)fVar134;
            auVar130._0_8_ = CONCAT44(~uVar54,~uVar53) & 0x7f8000007f800000;
            auVar130._8_4_ = ~uVar55 & 0x7f800000;
            auVar130._12_4_ = ~uVar58 & 0x7f800000;
            auVar130 = auVar130 | auVar90;
            auVar143._4_4_ = auVar130._0_4_;
            auVar143._0_4_ = auVar130._4_4_;
            auVar143._8_4_ = auVar130._12_4_;
            auVar143._12_4_ = auVar130._8_4_;
            auVar67 = minps(auVar143,auVar130);
            auVar91._0_8_ = auVar67._8_8_;
            auVar91._8_4_ = auVar67._0_4_;
            auVar91._12_4_ = auVar67._4_4_;
            auVar67 = minps(auVar91,auVar67);
            auVar92._0_8_ =
                 CONCAT44(-(uint)(auVar67._4_4_ == auVar130._4_4_) & uVar54,
                          -(uint)(auVar67._0_4_ == auVar130._0_4_) & uVar53);
            auVar92._8_4_ = -(uint)(auVar67._8_4_ == auVar130._8_4_) & uVar55;
            auVar92._12_4_ = -(uint)(auVar67._12_4_ == auVar130._12_4_) & uVar58;
            iVar39 = movmskps(iVar39,auVar92);
            auVar117 = local_388;
            if (iVar39 != 0) {
              auVar117._8_4_ = auVar92._8_4_;
              auVar117._0_8_ = auVar92._0_8_;
              auVar117._12_4_ = auVar92._12_4_;
            }
            uVar40 = movmskps(iVar39,auVar117);
            lVar42 = 0;
            if (CONCAT44(uVar46,uVar40) != 0) {
              for (; (CONCAT44(uVar46,uVar40) >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
              }
            }
            *(undefined4 *)(local_388 + lVar42 * 4) = 0;
            fVar105 = (ray->dir).field_0.m128[0];
            fVar136 = (ray->dir).field_0.m128[1];
            fVar148 = (ray->dir).field_0.m128[2];
            fVar149 = (ray->dir).field_0.m128[3];
            auVar19._4_4_ = fStack_324;
            auVar19._0_4_ = local_328;
            auVar19._8_4_ = fStack_320;
            auVar19._12_4_ = fStack_31c;
            auVar17._4_4_ = fStack_334;
            auVar17._0_4_ = local_338;
            auVar17._8_4_ = fStack_330;
            auVar17._12_4_ = fStack_32c;
            auVar241 = minps(auVar19,auVar17);
            auVar233 = maxps(auVar19,auVar17);
            auVar15._4_4_ = fStack_344;
            auVar15._0_4_ = local_348;
            auVar15._8_4_ = fStack_340;
            auVar15._12_4_ = fStack_33c;
            auVar13._4_4_ = fStack_354;
            auVar13._0_4_ = local_358;
            auVar13._8_4_ = fStack_350;
            auVar13._12_4_ = fStack_34c;
            auVar67 = minps(auVar15,auVar13);
            auVar241 = minps(auVar241,auVar67);
            auVar67 = maxps(auVar15,auVar13);
            auVar67 = maxps(auVar233,auVar67);
            auVar165._0_8_ = auVar241._0_8_ & 0x7fffffff7fffffff;
            auVar165._8_4_ = auVar241._8_4_ & 0x7fffffff;
            auVar165._12_4_ = auVar241._12_4_ & 0x7fffffff;
            local_418 = auVar67._12_4_;
            auVar93._0_8_ = auVar67._0_8_ & 0x7fffffff7fffffff;
            auVar93._8_4_ = auVar67._8_4_ & 0x7fffffff;
            auVar93._12_4_ = ABS(local_418);
            auVar67 = maxps(auVar165,auVar93);
            fVar150 = auVar67._4_4_;
            if (auVar67._4_4_ <= auVar67._0_4_) {
              fVar150 = auVar67._0_4_;
            }
            auVar166._8_8_ = auVar67._8_8_;
            auVar166._0_8_ = auVar67._8_8_;
            if (auVar67._8_4_ <= fVar150) {
              auVar166._0_4_ = fVar150;
            }
            fVar168 = auVar166._0_4_ * 1.9073486e-06;
            fStack_414 = local_418;
            fStack_410 = local_418;
            fStack_40c = local_418;
            fVar150 = local_118[lVar42];
            fVar167 = *(float *)(local_1d8 + lVar42 * 4);
            fVar169 = 0.0;
            fVar124 = 0.0;
            bVar51 = true;
            uVar41 = 0;
            do {
              fVar135 = SQRT(fVar148 * fVar148 + fVar136 * fVar136 + fVar105 * fVar105) *
                        1.9073486e-06 * fVar167;
              fVar179 = 1.0 - fVar150;
              fVar192 = fVar150 * 3.0;
              fVar178 = -fVar150 * fVar179 * fVar179 * 0.5;
              fVar237 = (fVar150 * fVar150 * (fVar192 + -5.0) + 2.0) * 0.5;
              fVar226 = ((fVar179 * 3.0 + -5.0) * fVar179 * fVar179 + 2.0) * 0.5;
              fVar238 = -fVar179 * fVar150 * fVar150 * 0.5;
              fVar180 = fVar178 * fStack_31c +
                        fVar237 * fStack_32c + fVar226 * fStack_33c + fVar238 * fStack_34c;
              fVar224 = (fVar150 * (fVar179 + fVar179) - fVar179 * fVar179) * 0.5;
              fVar194 = ((fVar150 + fVar150) * (fVar192 + -5.0) + fVar150 * fVar192) * 0.5;
              fVar193 = ((fVar192 + 2.0) * (fVar179 + fVar179) + fVar179 * -3.0 * fVar179) * 0.5;
              fVar179 = (fVar179 * -2.0 * fVar150 + fVar150 * fVar150) * 0.5;
              fVar239 = fVar224 * local_328 +
                        fVar194 * local_338 + fVar193 * local_348 + fVar179 * local_358;
              fVar246 = fVar224 * fStack_324 +
                        fVar194 * fStack_334 + fVar193 * fStack_344 + fVar179 * fStack_354;
              fVar247 = fVar224 * fStack_320 +
                        fVar194 * fStack_330 + fVar193 * fStack_340 + fVar179 * fStack_350;
              fVar248 = fVar224 * fStack_31c +
                        fVar194 * fStack_32c + fVar193 * fStack_33c + fVar179 * fStack_34c;
              fVar193 = fVar150 * -3.0 + 2.0;
              fVar225 = fVar150 * 9.0 + -5.0;
              fVar179 = fVar150 * -9.0 + 4.0;
              fVar192 = fVar192 + -1.0;
              fVar194 = fVar193 * local_328 +
                        fVar225 * local_338 + fVar179 * local_348 + fVar192 * local_358;
              fVar224 = fVar193 * fStack_324 +
                        fVar225 * fStack_334 + fVar179 * fStack_344 + fVar192 * fStack_354;
              fVar192 = fVar193 * fStack_320 +
                        fVar225 * fStack_330 + fVar179 * fStack_340 + fVar192 * fStack_350;
              fVar193 = (fVar167 * fVar105 + 0.0) -
                        (fVar178 * local_328 +
                        fVar237 * local_338 + fVar226 * local_348 + fVar238 * local_358);
              fVar225 = (fVar167 * fVar136 + 0.0) -
                        (fVar178 * fStack_324 +
                        fVar237 * fStack_334 + fVar226 * fStack_344 + fVar238 * fStack_354);
              fVar226 = (fVar167 * fVar148 + 0.0) -
                        (fVar178 * fStack_320 +
                        fVar237 * fStack_330 + fVar226 * fStack_340 + fVar238 * fStack_350);
              fVar179 = (fVar167 * fVar149 + 0.0) - fVar180;
              fVar178 = fVar225 * fVar225;
              fStack_5e0 = fVar226 * fVar226;
              fStack_5dc = fVar179 * fVar179;
              local_5e8._0_4_ = fVar178 + fVar193 * fVar193 + fStack_5e0;
              local_5e8._4_4_ = fVar178 + fVar178 + fStack_5dc;
              fStack_5e0 = fVar178 + fStack_5e0 + fStack_5e0;
              fStack_5dc = fVar178 + fStack_5dc + fStack_5dc;
              uStack_524 = auVar166._4_4_;
              uStack_520 = auVar166._8_4_;
              uStack_51c = auVar166._12_4_;
              fVar178 = fVar168;
              if (fVar168 <= fVar135) {
                fVar178 = fVar135;
              }
              fVar252 = fVar246 * fVar246 + fVar239 * fVar239 + fVar247 * fVar247;
              auVar241 = ZEXT416((uint)fVar252);
              auVar67 = rsqrtss(ZEXT416((uint)fVar252),auVar241);
              fVar135 = auVar67._0_4_;
              fVar255 = fVar135 * 1.5 - fVar135 * fVar135 * fVar252 * 0.5 * fVar135;
              fVar265 = fVar239 * fVar255;
              fVar266 = fVar246 * fVar255;
              fVar267 = fVar247 * fVar255;
              fVar268 = fVar248 * fVar255;
              fVar259 = fVar192 * fVar247 + fVar224 * fVar246 + fVar194 * fVar239;
              auVar67 = rcpss(auVar241,auVar241);
              fVar251 = (2.0 - fVar252 * auVar67._0_4_) * auVar67._0_4_;
              fVar135 = fVar225 * fVar266;
              fVar257 = fVar226 * fVar267;
              fVar258 = fVar179 * fVar268;
              fVar237 = fVar135 + fVar193 * fVar265 + fVar257;
              fVar260 = fVar135 + fVar135 + fVar258;
              fVar257 = fVar135 + fVar257 + fVar257;
              fVar258 = fVar135 + fVar258 + fVar258;
              fVar135 = (SQRT((float)local_5e8._0_4_) + 1.0) * (fVar168 / SQRT(fVar252)) +
                        SQRT((float)local_5e8._0_4_) * fVar168 + fVar178;
              fVar238 = fVar149 * fVar268;
              auVar219._0_4_ = fVar265 * -fVar239;
              auVar219._4_4_ = fVar266 * -fVar246;
              auVar219._8_4_ = fVar267 * -fVar247;
              auVar219._12_4_ = fVar268 * -fVar248;
              auVar220._8_8_ = auVar219._8_8_;
              auVar220._0_8_ = auVar220._8_8_;
              auVar221._4_12_ = auVar220._4_12_;
              auVar221._0_4_ =
                   auVar219._8_4_ + auVar219._4_4_ + auVar219._0_4_ +
                   fVar251 * (fVar252 * fVar192 - fVar259 * fVar247) * fVar255 * fVar226 +
                   fVar251 * (fVar252 * fVar224 - fVar259 * fVar246) * fVar255 * fVar225 +
                   fVar251 * (fVar252 * fVar194 - fVar259 * fVar239) * fVar255 * fVar193;
              fVar192 = fVar148 * fVar267 + fVar136 * fVar266 + fVar105 * fVar265;
              fVar252 = (float)local_5e8._0_4_ - fVar237 * fVar237;
              auVar94._0_8_ = CONCAT44((float)local_5e8._4_4_ - fVar260 * fVar260,fVar252);
              auVar94._8_4_ = fStack_5e0 - fVar257 * fVar257;
              auVar94._12_4_ = fStack_5dc - fVar258 * fVar258;
              fVar259 = -fVar247 * fVar226;
              fVar251 = -fVar248 * fVar179;
              fVar224 = (fVar259 + -fVar246 * fVar225 + -fVar239 * fVar193) -
                        fVar237 * auVar221._0_4_;
              fVar179 = fVar149 * fVar179;
              fVar194 = (fVar148 * fVar226 + fVar136 * fVar225 + fVar105 * fVar193) -
                        fVar237 * fVar192;
              auVar118._8_4_ = auVar94._8_4_;
              auVar118._0_8_ = auVar94._0_8_;
              auVar118._12_4_ = auVar94._12_4_;
              auVar67 = rsqrtss(auVar118,auVar94);
              fVar255 = auVar67._0_4_;
              auVar144._0_4_ = fVar255 * 1.5 - fVar255 * fVar255 * fVar252 * 0.5 * fVar255;
              auVar144._4_12_ = auVar67._4_12_;
              local_4a8 = fVar167;
              fStack_4a4 = fVar150;
              fStack_4a0 = fVar169;
              fStack_49c = fVar124;
              if (fVar252 < 0.0) {
                local_398._4_4_ = uStack_524;
                local_398._0_4_ = fVar178;
                fStack_390 = (float)uStack_520;
                fStack_38c = (float)uStack_51c;
                _local_408 = auVar144;
                local_3f8 = fVar194;
                fStack_3f4 = fVar179;
                fStack_3f0 = fVar148 * fVar226;
                fStack_3ec = fVar179;
                local_3e8 = fVar192;
                fStack_3e4 = fVar238;
                fStack_3e0 = fVar148 * fVar267;
                fStack_3dc = fVar238;
                local_3d8 = fVar237;
                fStack_3d4 = fVar260;
                fStack_3d0 = fVar257;
                fStack_3cc = fVar258;
                local_3c8 = auVar221;
                local_3b8 = fVar224;
                fStack_3b4 = fVar251;
                fStack_3b0 = fVar259;
                fStack_3ac = fVar251;
                local_3a8 = fVar135;
                fVar252 = sqrtf(fVar252);
                auVar144 = _local_408;
                uVar44 = local_3c8._0_8_;
                fVar135 = local_3a8;
                fVar178 = (float)local_398._0_4_;
                fVar237 = local_3d8;
                fVar192 = local_3e8;
                fVar238 = fStack_3e4;
                fVar194 = local_3f8;
                fVar179 = fStack_3f4;
                fVar224 = local_3b8;
                fVar251 = fStack_3b4;
              }
              else {
                fVar252 = SQRT(fVar252);
                uVar44 = auVar221._0_8_;
              }
              fVar252 = fVar252 - fVar180;
              fVar150 = fVar224 * auVar144._0_4_ - fVar248;
              fVar194 = fVar194 * auVar144._0_4_;
              auVar272._0_8_ = CONCAT44(fVar251,fVar150) ^ 0x8000000080000000;
              auVar145._0_4_ = (float)uVar44 * fVar194 - fVar192 * fVar150;
              auVar272._8_4_ = -fVar251;
              auVar272._12_4_ = fVar179;
              auVar271._8_8_ = auVar272._8_8_;
              auVar271._0_8_ = CONCAT44(fVar194,fVar150) ^ 0x80000000;
              auVar145._4_4_ = auVar145._0_4_;
              auVar145._8_4_ = auVar145._0_4_;
              auVar145._12_4_ = auVar145._0_4_;
              auVar241 = divps(auVar271,auVar145);
              auVar223._8_4_ = (int)((ulong)uVar44 >> 0x20);
              auVar223._0_8_ = uVar44;
              auVar223._12_4_ = -fVar238;
              auVar222._8_8_ = auVar223._8_8_;
              auVar222._0_8_ = CONCAT44(fVar192,(float)uVar44) ^ 0x8000000000000000;
              auVar67 = divps(auVar222,auVar145);
              fVar167 = local_4a8 - (fVar252 * auVar67._0_4_ + fVar237 * auVar241._0_4_);
              fVar150 = fStack_4a4 - (fVar252 * auVar67._4_4_ + fVar237 * auVar241._4_4_);
              fVar169 = fStack_4a0 - (fVar252 * auVar67._8_4_ + fVar237 * auVar241._8_4_);
              fVar124 = fStack_49c - (fVar252 * auVar67._12_4_ + fVar237 * auVar241._12_4_);
              if ((ABS(fVar237) < fVar135) &&
                 (ABS(fVar252) < local_418 * 1.9073486e-06 + fVar178 + fVar135)) {
                fVar167 = local_2e8._0_4_ + fVar167;
                uVar44 = 0;
                if ((fVar167 < (ray->org).field_0.m128[3]) ||
                   (((fVar105 = ray->tfar, fVar105 < fVar167 || (uVar44 = 0, fVar150 < 0.0)) ||
                    (1.0 < fVar150)))) goto LAB_00a7c2d2;
                auVar67 = rsqrtss(_local_5e8,_local_5e8);
                fVar136 = auVar67._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar52].ptr;
                if ((pGVar7->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (uVar44 = CONCAT71((int7)((ulong)context->args >> 8),1),
                     pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00a7c2d2;
                  fVar136 = fVar136 * 1.5 +
                            fVar136 * fVar136 * (float)local_5e8._0_4_ * -0.5 * fVar136;
                  fVar193 = fVar193 * fVar136;
                  fVar225 = fVar225 * fVar136;
                  fVar226 = fVar226 * fVar136;
                  fVar136 = fVar248 * fVar193 + fVar239;
                  fVar148 = fVar248 * fVar225 + fVar246;
                  fVar149 = fVar248 * fVar226 + fVar247;
                  fVar168 = fVar225 * fVar239 - fVar246 * fVar193;
                  fVar169 = fVar226 * fVar246 - fVar247 * fVar225;
                  fVar124 = fVar193 * fVar247 - fVar239 * fVar226;
                  local_498 = CONCAT44(fVar136 * fVar168 - fVar169 * fVar149,
                                       fVar149 * fVar124 - fVar168 * fVar148);
                  fStack_490 = fVar148 * fVar169 - fVar124 * fVar136;
                  fStack_48c = fVar150;
                  local_488 = 0;
                  local_484 = (int)local_370;
                  local_480 = uVar52;
                  local_47c = context->user->instID[0];
                  local_478 = context->user->instPrimID[0];
                  ray->tfar = fVar167;
                  local_4fc = 0xffffffff;
                  local_4f8.geometryUserPtr = pGVar7->userPtr;
                  local_4f8.valid = &local_4fc;
                  local_4f8.context = context->user;
                  local_4f8.hit = (RTCHitN *)&local_498;
                  local_4f8.N = 1;
                  local_4f8.ray = (RTCRayN *)ray;
                  if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a7c56c:
                    p_Var43 = context->args->filter;
                    if ((p_Var43 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var43)(&local_4f8);
                      p_Var43 = (RTCFilterFunctionN)local_4f8.valid;
                      if (*local_4f8.valid == 0) goto LAB_00a7c5d5;
                    }
                    uVar44 = CONCAT71((int7)((ulong)p_Var43 >> 8),1);
                    goto LAB_00a7c2d2;
                  }
                  (*pGVar7->occlusionFilterN)(&local_4f8);
                  if (*local_4f8.valid != 0) goto LAB_00a7c56c;
LAB_00a7c5d5:
                  ray->tfar = fVar105;
                }
                uVar44 = 0;
                goto LAB_00a7c2d2;
              }
              bVar51 = uVar41 < 4;
              uVar41 = uVar41 + 1;
            } while (uVar41 != 5);
            bVar51 = false;
            uVar44 = 5;
LAB_00a7c2d2:
            fVar105 = ray->tfar;
            local_388._0_4_ = -(uint)(local_428 <= fVar105) & local_388._0_4_;
            local_388._4_4_ = -(uint)(fStack_424 <= fVar105) & local_388._4_4_;
            local_388._8_4_ = -(uint)(fStack_420 <= fVar105) & local_388._8_4_;
            local_388._12_4_ = -(uint)(fStack_41c <= fVar105) & local_388._12_4_;
            bVar49 = (bool)(bVar49 | bVar51 & (byte)uVar44);
            uVar46 = (undefined4)((ulong)uVar44 >> 0x20);
            iVar39 = movmskps((int)uVar44,local_388);
          } while (iVar39 != 0);
          iVar39 = 0;
          prim = local_378;
        }
        auVar146._0_4_ =
             local_4c8._0_4_ & local_308._0_4_ &
             -(uint)(fVar100 + (float)local_138._0_4_ <= fVar105);
        auVar146._4_4_ =
             local_4c8._4_4_ & local_308._4_4_ &
             -(uint)(fVar100 + (float)local_138._4_4_ <= fVar105);
        auVar146._8_4_ =
             (uint)fStack_4c0 & (uint)fStack_300 & -(uint)(fVar100 + fStack_130 <= fVar105);
        auVar146._12_4_ =
             (uint)fStack_4bc & (uint)fStack_2fc & -(uint)(fVar100 + fStack_12c <= fVar105);
        auVar95._0_4_ =
             local_448._0_4_ & local_458._0_4_ & -(uint)(fVar100 + local_1e8._0_4_ <= fVar105);
        auVar95._4_4_ =
             local_448._4_4_ & local_458._4_4_ & -(uint)(fVar100 + local_1e8._4_4_ <= fVar105);
        auVar95._8_4_ =
             (uint)fStack_440 & (uint)fStack_450 & -(uint)(fVar100 + local_1e8._8_4_ <= fVar105);
        auVar95._12_4_ =
             (uint)fStack_43c & (uint)fStack_44c & -(uint)(fVar100 + local_1e8._12_4_ <= fVar105);
        uVar53 = movmskps(iVar39,auVar95 | auVar146);
        pauVar45 = (undefined1 (*) [16])(ulong)uVar53;
        if (uVar53 != 0) {
          pauVar45 = (undefined1 (*) [16])(uVar48 * 0x30);
          *(undefined1 (*) [16])(auStack_f8 + (long)pauVar45) = auVar95 | auVar146;
          auStack_e8[uVar48 * 0xc] =
               ~auVar146._0_4_ & (uint)local_1e8._0_4_ | local_138._0_4_ & auVar146._0_4_;
          *(uint *)(&stack0x0000000c + (long)pauVar45[-0xf]) =
               ~auVar146._4_4_ & (uint)local_1e8._4_4_ | local_138._4_4_ & auVar146._4_4_;
          *(uint *)(&stack0x00000000 + (long)pauVar45[-0xe]) =
               ~auVar146._8_4_ & (uint)local_1e8._8_4_ | (uint)fStack_130 & auVar146._8_4_;
          *(uint *)(&stack0x00000004 + (long)pauVar45[-0xe]) =
               ~auVar146._12_4_ & (uint)local_1e8._12_4_ | (uint)fStack_12c & auVar146._12_4_;
          (&uStack_d8)[uVar48 * 6] = CONCAT44(fStack_174,local_178);
          aiStack_d0[uVar48 * 0xc] = local_57c + 1;
          iVar50 = iVar50 + 1;
        }
      }
    }
    fVar105 = ray->tfar;
    if (iVar50 == 0) break;
    uVar54 = -iVar50;
    pauVar45 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar50 - 1) * 0x30);
    uVar53 = uVar54;
    while( true ) {
      local_4f8.valid._0_4_ =
           -(uint)(fVar100 + *(float *)pauVar45[1] <= fVar105) & *(uint *)*pauVar45;
      local_4f8.valid._4_4_ =
           -(uint)(fVar100 + *(float *)(pauVar45[1] + 4) <= fVar105) & *(uint *)(*pauVar45 + 4);
      local_4f8.geometryUserPtr._0_4_ =
           -(uint)(fVar100 + *(float *)(pauVar45[1] + 8) <= fVar105) & *(uint *)(*pauVar45 + 8);
      local_4f8.geometryUserPtr._4_4_ =
           -(uint)(fVar100 + *(float *)(pauVar45[1] + 0xc) <= fVar105) & *(uint *)(*pauVar45 + 0xc);
      iVar39 = movmskps(uVar54,(undefined1  [16])local_4f8._0_16_);
      if (iVar39 != 0) break;
      pauVar45 = pauVar45 + -3;
      uVar53 = uVar53 + 1;
      uVar54 = 0;
      if (uVar53 == 0) goto LAB_00a7c817;
    }
    auVar131._0_4_ = (uint)*(float *)pauVar45[1] & (uint)local_4f8.valid;
    auVar131._4_4_ = (uint)*(float *)(pauVar45[1] + 4) & local_4f8.valid._4_4_;
    auVar131._8_4_ = (uint)*(float *)(pauVar45[1] + 8) & (uint)local_4f8.geometryUserPtr;
    auVar131._12_4_ = (uint)*(float *)(pauVar45[1] + 0xc) & local_4f8.geometryUserPtr._4_4_;
    auVar147._0_8_ = CONCAT44(~local_4f8.valid._4_4_,~(uint)local_4f8.valid) & 0x7f8000007f800000;
    auVar147._8_4_ = ~(uint)local_4f8.geometryUserPtr & 0x7f800000;
    auVar147._12_4_ = ~local_4f8.geometryUserPtr._4_4_ & 0x7f800000;
    auVar147 = auVar147 | auVar131;
    auVar132._4_4_ = auVar147._0_4_;
    auVar132._0_4_ = auVar147._4_4_;
    auVar132._8_4_ = auVar147._12_4_;
    auVar132._12_4_ = auVar147._8_4_;
    auVar67 = minps(auVar132,auVar147);
    auVar96._0_8_ = auVar67._8_8_;
    auVar96._8_4_ = auVar67._0_4_;
    auVar96._12_4_ = auVar67._4_4_;
    auVar67 = minps(auVar96,auVar67);
    auVar97._0_8_ =
         CONCAT44(-(uint)(auVar67._4_4_ == auVar147._4_4_) & local_4f8.valid._4_4_,
                  -(uint)(auVar67._0_4_ == auVar147._0_4_) & (uint)local_4f8.valid);
    auVar97._8_4_ = -(uint)(auVar67._8_4_ == auVar147._8_4_) & (uint)local_4f8.geometryUserPtr;
    auVar97._12_4_ = -(uint)(auVar67._12_4_ == auVar147._12_4_) & local_4f8.geometryUserPtr._4_4_;
    iVar39 = movmskps(iVar39,auVar97);
    auVar119 = (undefined1  [16])local_4f8._0_16_;
    if (iVar39 != 0) {
      auVar119._8_4_ = auVar97._8_4_;
      auVar119._0_8_ = auVar97._0_8_;
      auVar119._12_4_ = auVar97._12_4_;
    }
    uVar44 = *(undefined8 *)pauVar45[2];
    local_57c = *(int *)(pauVar45[2] + 8);
    uVar54 = movmskps(local_57c,auVar119);
    lVar42 = 0;
    if (uVar54 != 0) {
      for (; (uVar54 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
      }
    }
    *(undefined4 *)((long)&local_4f8.valid + lVar42 * 4) = 0;
    *pauVar45 = (undefined1  [16])local_4f8._0_16_;
    iVar39 = movmskps((int)pauVar45,(undefined1  [16])local_4f8._0_16_);
    uVar41 = CONCAT44((int)((ulong)pauVar45 >> 0x20),iVar39);
    uVar54 = ~uVar53;
    if (iVar39 != 0) {
      uVar54 = -uVar53;
    }
    uVar48 = (ulong)uVar54;
    fVar105 = (float)uVar44;
    fVar121 = (float)((ulong)uVar44 >> 0x20) - fVar105;
    local_498 = CONCAT44(fVar121 * 0.33333334 + fVar105,fVar121 * 0.0 + fVar105);
    fStack_490 = fVar121 * 0.6666667 + fVar105;
    fStack_48c = fVar121 * 1.0 + fVar105;
    local_178 = *(float *)((long)&local_498 + lVar42 * 4);
    fStack_174 = *(float *)((long)&local_498 + lVar42 * 4 + 4);
  } while( true );
LAB_00a7c817:
  if (bVar49 != false) {
    return bVar49;
  }
  auVar120._4_4_ = -(uint)(fStack_1c4 <= fVar105);
  auVar120._0_4_ = -(uint)(local_1c8 <= fVar105);
  auVar120._8_4_ = -(uint)(fStack_1c0 <= fVar105);
  auVar120._12_4_ = -(uint)(fStack_1bc <= fVar105);
  uVar52 = movmskps((int)pauVar45,auVar120);
  uVar52 = (uint)uVar47 & uVar52;
  if (uVar52 == 0) {
    return false;
  }
  goto LAB_00a79ef5;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }